

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::execute
          (DuplicateColsPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *param_2,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *param_3,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  double a;
  fpclass_type fVar1;
  int32_t iVar2;
  type_conflict5 tVar3;
  bool bVar4;
  int iVar5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  undefined8 *puVar7;
  VarStatus VVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  pointer pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  uint *puVar20;
  soplex *psVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  pointer pnVar24;
  long lVar25;
  long lVar26;
  long in_FS_OFFSET;
  byte bVar27;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  cpp_dec_float<200U,_int,_void> local_2838;
  cpp_dec_float<200U,_int,_void> local_27b8;
  cpp_dec_float<200U,_int,_void> local_2738;
  cpp_dec_float<200U,_int,_void> local_26b8;
  cpp_dec_float<200U,_int,_void> local_2638;
  cpp_dec_float<200U,_int,_void> local_25b8;
  cpp_dec_float<200U,_int,_void> local_2538;
  cpp_dec_float<200U,_int,_void> local_24b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2438;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_23b8;
  cpp_dec_float<200U,_int,_void> local_2338;
  cpp_dec_float<200U,_int,_void> local_22b8;
  cpp_dec_float<200U,_int,_void> local_2238;
  cpp_dec_float<200U,_int,_void> local_21b8;
  cpp_dec_float<200U,_int,_void> local_2138;
  cpp_dec_float<200U,_int,_void> local_20b8;
  cpp_dec_float<200U,_int,_void> local_2038;
  cpp_dec_float<200U,_int,_void> local_1fb8;
  cpp_dec_float<200U,_int,_void> local_1f38;
  cpp_dec_float<200U,_int,_void> local_1eb8;
  cpp_dec_float<200U,_int,_void> local_1e38;
  cpp_dec_float<200U,_int,_void> local_1db8;
  undefined8 local_1d38;
  undefined8 uStack_1d30;
  undefined8 local_1d28;
  undefined8 uStack_1d20;
  undefined8 local_1d18;
  undefined8 uStack_1d10;
  undefined8 local_1d08;
  undefined8 uStack_1d00;
  undefined8 local_1cf8;
  undefined8 uStack_1cf0;
  undefined8 local_1ce8;
  undefined8 uStack_1ce0;
  undefined8 local_1cd8;
  undefined5 uStack_1cd0;
  undefined3 uStack_1ccb;
  undefined5 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 local_1cb8;
  undefined8 uStack_1cb0;
  undefined8 local_1ca8;
  undefined8 uStack_1ca0;
  undefined8 local_1c98;
  undefined8 uStack_1c90;
  undefined8 local_1c88;
  undefined8 uStack_1c80;
  undefined8 local_1c78;
  undefined8 uStack_1c70;
  undefined8 local_1c68;
  undefined8 uStack_1c60;
  undefined8 local_1c58;
  undefined5 uStack_1c50;
  undefined3 uStack_1c4b;
  undefined5 uStack_1c48;
  undefined8 local_1c40;
  undefined8 local_1c38;
  undefined8 uStack_1c30;
  undefined8 local_1c28;
  undefined8 uStack_1c20;
  undefined8 local_1c18;
  undefined8 uStack_1c10;
  undefined8 local_1c08;
  undefined8 uStack_1c00;
  undefined8 local_1bf8;
  undefined8 uStack_1bf0;
  undefined8 local_1be8;
  undefined8 uStack_1be0;
  undefined8 local_1bd8;
  undefined5 uStack_1bd0;
  undefined3 uStack_1bcb;
  undefined5 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 local_1bb8;
  undefined8 uStack_1bb0;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b98;
  undefined8 uStack_1b90;
  undefined8 local_1b88;
  undefined8 uStack_1b80;
  undefined8 local_1b78;
  undefined8 uStack_1b70;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b58;
  undefined5 uStack_1b50;
  undefined3 uStack_1b4b;
  undefined5 uStack_1b48;
  undefined8 local_1b40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_19b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_18b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_17b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_16b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_15b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_14b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_13b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_12b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_11b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_10b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1030;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_fb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_f30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_eb0;
  undefined1 local_e30 [128];
  soplex local_db0 [112];
  int local_d40;
  undefined1 local_d3c;
  undefined8 local_d38;
  uint local_d30 [28];
  int local_cc0;
  undefined1 local_cbc;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_cb8;
  soplex local_cb0 [112];
  int local_c40;
  undefined1 local_c3c;
  undefined8 local_c38;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bb0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ab0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_630;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar27 = 0;
  if (this->m_isFirst != false) {
    return;
  }
  if (this->m_isLast == true) {
    lVar11 = (long)(this->m_perm).thesize;
    if (lVar11 < 1) {
      return;
    }
    lVar25 = lVar11 + 1;
    lVar11 = lVar11 * 0x20 + -2;
    do {
      lVar26 = (long)(this->m_perm).data[lVar25 + -2];
      if (-1 < lVar26) {
        pnVar24 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar15 = (pnVar24->m_backend).data._M_elems + lVar11;
        puVar14 = (uint *)(pnVar24 + lVar26);
        puVar20 = puVar15 + 0xffffffffffffffe2;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar20 = *puVar14;
          puVar14 = puVar14 + 1;
          puVar20 = puVar20 + 1;
        }
        puVar15[0xfffffffffffffffe] = pnVar24[lVar26].m_backend.exp;
        *(bool *)(puVar15 + 0xffffffffffffffff) = pnVar24[lVar26].m_backend.neg;
        iVar2 = pnVar24[lVar26].m_backend.prec_elem;
        puVar15[0] = pnVar24[lVar26].m_backend.fpclass;
        puVar15[1] = iVar2;
        pnVar24 = (r->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar15 = (pnVar24->m_backend).data._M_elems + lVar11 + -0x1e;
        puVar14 = (uint *)(pnVar24 + lVar26);
        puVar20 = puVar15;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar20 = *puVar14;
          puVar14 = puVar14 + 1;
          puVar20 = puVar20 + 1;
        }
        puVar15[0x1c] = pnVar24[lVar26].m_backend.exp;
        *(bool *)(puVar15 + 0x1d) = pnVar24[lVar26].m_backend.neg;
        *(undefined8 *)(puVar15 + 0x1e) = *(undefined8 *)&pnVar24[lVar26].m_backend.fpclass;
        cStatus->data[lVar25 + -2] = cStatus->data[lVar26];
      }
      lVar25 = lVar25 + -1;
      lVar11 = lVar11 + -0x20;
    } while (1 < lVar25);
    return;
  }
  iVar5 = this->m_k;
  switch(cStatus->data[iVar5]) {
  case ON_UPPER:
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &this->m_upK;
    puVar15 = (uint *)(pnVar24 + iVar5);
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar16->m_backend).data._M_elems + 1);
      puVar15 = puVar15 + 1;
    }
    pnVar24[iVar5].m_backend.exp = (this->m_upK).m_backend.exp;
    pnVar24[iVar5].m_backend.neg = (this->m_upK).m_backend.neg;
    iVar2 = (this->m_upK).m_backend.prec_elem;
    pnVar24[iVar5].m_backend.fpclass = (this->m_upK).m_backend.fpclass;
    pnVar24[iVar5].m_backend.prec_elem = iVar2;
    if ((this->m_scale).m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_2738,0,(type *)0x0);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->m_scale).m_backend,&local_2738);
      if (0 < iVar5) {
        iVar5 = this->m_j;
        pnVar24 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar16 = &this->m_upJ;
        pnVar12 = pnVar24 + iVar5;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        pnVar24[iVar5].m_backend.exp = (this->m_upJ).m_backend.exp;
        pnVar24[iVar5].m_backend.neg = (this->m_upJ).m_backend.neg;
        iVar2 = (this->m_upJ).m_backend.prec_elem;
        pnVar24[iVar5].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
        pnVar24[iVar5].m_backend.prec_elem = iVar2;
        if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) {
          VVar8 = ON_UPPER;
        }
        else {
          VVar8 = ON_UPPER;
          if ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
            VVar8 = (uint)(iVar5 == 0) * 2;
          }
        }
        cStatus->data[this->m_j] = VVar8;
        break;
      }
    }
LAB_0058d59e:
    iVar5 = this->m_j;
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &this->m_loJ;
    pnVar12 = pnVar24 + iVar5;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    pnVar24[iVar5].m_backend.exp = (this->m_loJ).m_backend.exp;
    pnVar24[iVar5].m_backend.neg = (this->m_loJ).m_backend.neg;
    iVar2 = (this->m_loJ).m_backend.prec_elem;
    pnVar24[iVar5].m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    pnVar24[iVar5].m_backend.prec_elem = iVar2;
    VVar8 = ON_LOWER;
    if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
      VVar8 = (iVar5 == 0) + ON_LOWER;
    }
    goto LAB_0058d688;
  case ON_LOWER:
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &this->m_loK;
    puVar15 = (uint *)(pnVar24 + iVar5);
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar16->m_backend).data._M_elems + 1);
      puVar15 = puVar15 + 1;
    }
    pnVar24[iVar5].m_backend.exp = (this->m_loK).m_backend.exp;
    pnVar24[iVar5].m_backend.neg = (this->m_loK).m_backend.neg;
    iVar2 = (this->m_loK).m_backend.prec_elem;
    pnVar24[iVar5].m_backend.fpclass = (this->m_loK).m_backend.fpclass;
    pnVar24[iVar5].m_backend.prec_elem = iVar2;
    if ((this->m_scale).m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_2738,0,(type *)0x0);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->m_scale).m_backend,&local_2738);
      if (0 < iVar5) goto LAB_0058d59e;
    }
    iVar5 = this->m_j;
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &this->m_upJ;
    pnVar12 = pnVar24 + iVar5;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    pnVar24[iVar5].m_backend.exp = (this->m_upJ).m_backend.exp;
    pnVar24[iVar5].m_backend.neg = (this->m_upJ).m_backend.neg;
    iVar2 = (this->m_upJ).m_backend.prec_elem;
    pnVar24[iVar5].m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
    pnVar24[iVar5].m_backend.prec_elem = iVar2;
    VVar8 = ON_UPPER;
    if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
       ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
      iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&(this->m_loJ).m_backend,&(this->m_upJ).m_backend);
      VVar8 = (uint)(iVar5 == 0) * 2;
    }
LAB_0058d688:
    cStatus->data[this->m_j] = VVar8;
    break;
  case FIXED:
    iVar5 = this->m_j;
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar16 = &this->m_loJ;
    puVar15 = (uint *)(pnVar24 + iVar5);
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar16->m_backend).data._M_elems + 1);
      puVar15 = puVar15 + 1;
    }
    pnVar24[iVar5].m_backend.exp = (this->m_loJ).m_backend.exp;
    pnVar24[iVar5].m_backend.neg = (this->m_loJ).m_backend.neg;
    iVar2 = (this->m_loJ).m_backend.prec_elem;
    pnVar24[iVar5].m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    pnVar24[iVar5].m_backend.prec_elem = iVar2;
    cStatus->data[this->m_j] = FIXED;
    break;
  case ZERO:
    pnVar16 = &this->m_loK;
    pnVar19 = pnVar16;
    puVar15 = local_b0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar19->m_backend).data._M_elems + 1);
      puVar15 = puVar15 + 1;
    }
    local_40 = (this->m_loK).m_backend.exp;
    local_3c = (this->m_loK).m_backend.neg;
    local_38._0_4_ = (this->m_loK).m_backend.fpclass;
    local_38._4_4_ = (this->m_loK).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_130,this);
    bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_b0,&local_130);
    if (bVar4) {
      pnVar19 = &this->m_upK;
      pnVar18 = &local_1b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = (this->m_upK).m_backend.exp;
      local_1b0.m_backend.neg = (this->m_upK).m_backend.neg;
      local_1b0.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
      local_1b0.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_230,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1b0,&local_230);
      if ((((!bVar4) || ((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN)) ||
          ((this->m_upK).m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar16->m_backend,&(this->m_upK).m_backend), iVar5 != 0))
      goto LAB_0058d181;
      VVar8 = FIXED;
    }
    else {
LAB_0058d181:
      pnVar19 = pnVar16;
      pnVar18 = &local_2b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = (this->m_loK).m_backend.exp;
      local_2b0.m_backend.neg = (this->m_loK).m_backend.neg;
      local_2b0.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
      local_2b0.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_330,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_2b0,&local_330);
      VVar8 = ON_LOWER;
      if (!bVar4) {
        pnVar19 = &this->m_upK;
        pnVar18 = &local_3b0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
          pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_3b0.m_backend.exp = (this->m_upK).m_backend.exp;
        local_3b0.m_backend.neg = (this->m_upK).m_backend.neg;
        local_3b0.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
        local_3b0.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_430,this);
        bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_3b0,&local_430);
        VVar8 = ON_UPPER;
        if (!bVar4) {
          pnVar19 = &local_4b0;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_4b0.m_backend.exp = (this->m_loK).m_backend.exp;
          local_4b0.m_backend.neg = (this->m_loK).m_backend.neg;
          local_4b0.m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          local_4b0.m_backend.prec_elem = (this->m_loK).m_backend.prec_elem;
          local_1b40 = 0x1c00000000;
          local_1bb8 = 0;
          uStack_1bb0 = 0;
          local_1ba8 = 0;
          uStack_1ba0 = 0;
          local_1b98 = 0;
          uStack_1b90 = 0;
          local_1b88 = 0;
          uStack_1b80 = 0;
          local_1b78 = 0;
          uStack_1b70 = 0;
          local_1b68 = 0;
          uStack_1b60 = 0;
          local_1b58 = 0;
          uStack_1b50 = 0;
          uStack_1b4b = 0;
          uStack_1b48 = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_1bb8,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_530,this);
          bVar4 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_4b0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1bb8,&local_530);
          if (!bVar4) {
LAB_0058f063:
            puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_2738.data._M_elems._0_8_ = local_2738.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2738,"XMAISM05 This should never happen.","");
            *puVar7 = &PTR__SPxException_006a9ee8;
            puVar7[1] = puVar7 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar7 + 1),local_2738.data._M_elems._0_8_,
                       local_2738.data._M_elems._0_8_ + local_2738.data._M_elems._8_8_);
            *puVar7 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar7,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          pnVar16 = &this->m_upK;
          pnVar19 = &local_5b0;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_5b0.m_backend.exp = (this->m_upK).m_backend.exp;
          local_5b0.m_backend.neg = (this->m_upK).m_backend.neg;
          local_5b0.m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          local_5b0.m_backend.prec_elem = (this->m_upK).m_backend.prec_elem;
          local_1bc0 = 0x1c00000000;
          local_1c38 = 0;
          uStack_1c30 = 0;
          local_1c28 = 0;
          uStack_1c20 = 0;
          local_1c18 = 0;
          uStack_1c10 = 0;
          local_1c08 = 0;
          uStack_1c00 = 0;
          local_1bf8 = 0;
          uStack_1bf0 = 0;
          local_1be8 = 0;
          uStack_1be0 = 0;
          local_1bd8 = 0;
          uStack_1bd0 = 0;
          uStack_1bcb = 0;
          uStack_1bc8 = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_1c38,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_630,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_5b0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1c38,&local_630);
          VVar8 = ZERO;
          if (!bVar4) goto LAB_0058f063;
        }
      }
    }
    cStatus->data[this->m_k] = VVar8;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)
               ((x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
    pnVar16 = &this->m_loJ;
    pnVar19 = pnVar16;
    pnVar18 = &local_6b0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    local_6b0.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_6b0.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_6b0.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_6b0.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_730,this);
    bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_6b0,&local_730);
    if (bVar4) {
      pnVar19 = &this->m_upJ;
      pnVar18 = &local_7b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_7b0.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_7b0.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_7b0.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_7b0.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_830,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_7b0,&local_830);
      if (((bVar4) && ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN)) &&
         (((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN &&
          (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             (&pnVar16->m_backend,&(this->m_upJ).m_backend), iVar5 == 0)))) {
        cStatus->data[this->m_j] = FIXED;
        break;
      }
    }
    pnVar19 = pnVar16;
    pnVar18 = &local_8b0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    local_8b0.m_backend.exp = (this->m_loJ).m_backend.exp;
    local_8b0.m_backend.neg = (this->m_loJ).m_backend.neg;
    local_8b0.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
    local_8b0.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_930,this);
    bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_8b0,&local_930);
    if (bVar4) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      pnVar19 = &this->m_upJ;
      pnVar18 = &local_9b0;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar18->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_9b0.m_backend.exp = (this->m_upJ).m_backend.exp;
      local_9b0.m_backend.neg = (this->m_upJ).m_backend.neg;
      local_9b0.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
      local_9b0.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_a30,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_9b0,&local_a30);
      if (!bVar4) {
        pnVar19 = &local_ab0;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_ab0.m_backend.exp = (this->m_loJ).m_backend.exp;
        local_ab0.m_backend.neg = (this->m_loJ).m_backend.neg;
        local_ab0.m_backend.fpclass = (this->m_loJ).m_backend.fpclass;
        local_ab0.m_backend.prec_elem = (this->m_loJ).m_backend.prec_elem;
        local_1c40 = 0x1c00000000;
        local_1cb8 = 0;
        uStack_1cb0 = 0;
        local_1ca8 = 0;
        uStack_1ca0 = 0;
        local_1c98 = 0;
        uStack_1c90 = 0;
        local_1c88 = 0;
        uStack_1c80 = 0;
        local_1c78 = 0;
        uStack_1c70 = 0;
        local_1c68 = 0;
        uStack_1c60 = 0;
        local_1c58 = 0;
        uStack_1c50 = 0;
        uStack_1c4b = 0;
        uStack_1c48 = 0;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_1cb8,0.0);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_b30,this);
        bVar4 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_ab0,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1cb8,&local_b30);
        if (bVar4) {
          pnVar16 = &this->m_upJ;
          pnVar19 = &local_bb0;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_bb0.m_backend.exp = (this->m_upJ).m_backend.exp;
          local_bb0.m_backend.neg = (this->m_upJ).m_backend.neg;
          local_bb0.m_backend.fpclass = (this->m_upJ).m_backend.fpclass;
          local_bb0.m_backend.prec_elem = (this->m_upJ).m_backend.prec_elem;
          local_1cc0 = 0x1c00000000;
          local_1d38 = 0;
          uStack_1d30 = 0;
          local_1d28 = 0;
          uStack_1d20 = 0;
          local_1d18 = 0;
          uStack_1d10 = 0;
          local_1d08 = 0;
          uStack_1d00 = 0;
          local_1cf8 = 0;
          uStack_1cf0 = 0;
          local_1ce8 = 0;
          uStack_1ce0 = 0;
          local_1cd8 = 0;
          uStack_1cd0 = 0;
          uStack_1ccb = 0;
          uStack_1cc8 = 0;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_1d38,0.0);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_c30,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_bb0,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1d38,&local_c30);
          if (bVar4) {
            cStatus->data[this->m_j] = ZERO;
            break;
          }
        }
        puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_2738.data._M_elems._0_8_ = local_2738.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2738,"XMAISM06 This should never happen.","");
        *puVar7 = &PTR__SPxException_006a9ee8;
        puVar7[1] = puVar7 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar7 + 1),local_2738.data._M_elems._0_8_,
                   local_2738.data._M_elems._0_8_ + local_2738.data._M_elems._8_8_);
        *puVar7 = &PTR__SPxException_006a9ec0;
        __cxa_throw(puVar7,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      cStatus->data[this->m_j] = ON_UPPER;
    }
    break;
  case BASIC:
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = (uint *)(pnVar24 + iVar5);
    psVar21 = local_cb0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(uint *)psVar21 = *puVar15;
      puVar15 = puVar15 + 1;
      psVar21 = psVar21 + 4;
    }
    local_c40 = pnVar24[iVar5].m_backend.exp;
    local_c3c = pnVar24[iVar5].m_backend.neg;
    local_c38._0_4_ = pnVar24[iVar5].m_backend.fpclass;
    local_c38._4_4_ = pnVar24[iVar5].m_backend.prec_elem;
    pnVar16 = &this->m_loK;
    pnVar19 = pnVar16;
    puVar15 = local_d30;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *puVar15 = (pnVar19->m_backend).data._M_elems[0];
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((pnVar19->m_backend).data._M_elems + 1);
      puVar15 = puVar15 + 1;
    }
    local_cc0 = (this->m_loK).m_backend.exp;
    local_cbc = (this->m_loK).m_backend.neg;
    local_cb8 = *(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  **)&(this->m_loK).m_backend.fpclass;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_2738,local_cb0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_d30,local_cb8);
    iVar5 = this->m_k;
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar12 = pnVar24 + iVar5;
    psVar21 = local_db0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      *(undefined4 *)psVar21 = (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
      psVar21 = psVar21 + (ulong)bVar27 * -8 + 4;
    }
    local_d40 = pnVar24[iVar5].m_backend.exp;
    local_d3c = pnVar24[iVar5].m_backend.neg;
    local_d38._0_4_ = pnVar24[iVar5].m_backend.fpclass;
    local_d38._4_4_ = pnVar24[iVar5].m_backend.prec_elem;
    pnVar19 = &this->m_upK;
    pnVar18 = pnVar19;
    pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)local_e30;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar22->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + (ulong)bVar27 * -8 + 4);
      pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar22 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    local_e30._112_4_ = (this->m_upK).m_backend.exp;
    local_e30[0x74] = (this->m_upK).m_backend.neg;
    local_e30._120_8_ = *(undefined8 *)&(this->m_upK).m_backend.fpclass;
    maxAbs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_26b8,local_db0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_e30,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_e30._120_8_);
    local_25b8.data._M_elems[0] = 0;
    local_25b8.data._M_elems[1] = 0x3ff00000;
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2738,(double *)&local_25b8);
    if (tVar3) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2738,1.0);
    }
    local_25b8.data._M_elems[0] = 0;
    local_25b8.data._M_elems[1] = 0x3ff00000;
    tVar3 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_26b8,(double *)&local_25b8);
    if (tVar3) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_26b8,1.0);
    }
    local_2638.fpclass = cpp_dec_float_finite;
    local_2638.prec_elem = 0x1c;
    local_2638.data._M_elems[0] = 0;
    local_2638.data._M_elems[1] = 0;
    local_2638.data._M_elems[2] = 0;
    local_2638.data._M_elems[3] = 0;
    local_2638.data._M_elems[4] = 0;
    local_2638.data._M_elems[5] = 0;
    local_2638.data._M_elems[6] = 0;
    local_2638.data._M_elems[7] = 0;
    local_2638.data._M_elems[8] = 0;
    local_2638.data._M_elems[9] = 0;
    local_2638.data._M_elems[10] = 0;
    local_2638.data._M_elems[0xb] = 0;
    local_2638.data._M_elems[0xc] = 0;
    local_2638.data._M_elems[0xd] = 0;
    local_2638.data._M_elems[0xe] = 0;
    local_2638.data._M_elems[0xf] = 0;
    local_2638.data._M_elems[0x10] = 0;
    local_2638.data._M_elems[0x11] = 0;
    local_2638.data._M_elems[0x12] = 0;
    local_2638.data._M_elems[0x13] = 0;
    local_2638.data._M_elems[0x14] = 0;
    local_2638.data._M_elems[0x15] = 0;
    local_2638.data._M_elems[0x16] = 0;
    local_2638.data._M_elems[0x17] = 0;
    local_2638.data._M_elems[0x18] = 0;
    local_2638.data._M_elems[0x19] = 0;
    local_2638.data._M_elems._104_5_ = 0;
    local_2638.data._M_elems[0x1b]._1_3_ = 0;
    local_2638.exp = 0;
    local_2638.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2638,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_2738);
    local_2838.fpclass = cpp_dec_float_finite;
    local_2838.prec_elem = 0x1c;
    local_2838.data._M_elems[0] = 0;
    local_2838.data._M_elems[1] = 0;
    local_2838.data._M_elems[2] = 0;
    local_2838.data._M_elems[3] = 0;
    local_2838.data._M_elems[4] = 0;
    local_2838.data._M_elems[5] = 0;
    local_2838.data._M_elems[6] = 0;
    local_2838.data._M_elems[7] = 0;
    local_2838.data._M_elems[8] = 0;
    local_2838.data._M_elems[9] = 0;
    local_2838.data._M_elems[10] = 0;
    local_2838.data._M_elems[0xb] = 0;
    local_2838.data._M_elems[0xc] = 0;
    local_2838.data._M_elems[0xd] = 0;
    local_2838.data._M_elems[0xe] = 0;
    local_2838.data._M_elems[0xf] = 0;
    local_2838.data._M_elems[0x10] = 0;
    local_2838.data._M_elems[0x11] = 0;
    local_2838.data._M_elems[0x12] = 0;
    local_2838.data._M_elems[0x13] = 0;
    local_2838.data._M_elems[0x14] = 0;
    local_2838.data._M_elems[0x15] = 0;
    local_2838.data._M_elems[0x16] = 0;
    local_2838.data._M_elems[0x17] = 0;
    local_2838.data._M_elems[0x18] = 0;
    local_2838.data._M_elems[0x19] = 0;
    local_2838.data._M_elems._104_5_ = 0;
    local_2838.data._M_elems[0x1b]._1_3_ = 0;
    local_2838.exp = 0;
    local_2838.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2838,&pnVar16->m_backend,&local_2738);
    local_25b8.fpclass = cpp_dec_float_finite;
    local_25b8.prec_elem = 0x1c;
    local_25b8.data._M_elems[0] = 0;
    local_25b8.data._M_elems[1] = 0;
    local_25b8.data._M_elems[2] = 0;
    local_25b8.data._M_elems[3] = 0;
    local_25b8.data._M_elems[4] = 0;
    local_25b8.data._M_elems[5] = 0;
    local_25b8.data._M_elems[6] = 0;
    local_25b8.data._M_elems[7] = 0;
    local_25b8.data._M_elems[8] = 0;
    local_25b8.data._M_elems[9] = 0;
    local_25b8.data._M_elems[10] = 0;
    local_25b8.data._M_elems[0xb] = 0;
    local_25b8.data._M_elems[0xc] = 0;
    local_25b8.data._M_elems[0xd] = 0;
    local_25b8.data._M_elems[0xe] = 0;
    local_25b8.data._M_elems[0xf] = 0;
    local_25b8.data._M_elems[0x10] = 0;
    local_25b8.data._M_elems[0x11] = 0;
    local_25b8.data._M_elems[0x12] = 0;
    local_25b8.data._M_elems[0x13] = 0;
    local_25b8.data._M_elems[0x14] = 0;
    local_25b8.data._M_elems[0x15] = 0;
    local_25b8.data._M_elems[0x16] = 0;
    local_25b8.data._M_elems[0x17] = 0;
    local_25b8.data._M_elems[0x18] = 0;
    local_25b8.data._M_elems[0x19] = 0;
    local_25b8.data._M_elems._104_5_ = 0;
    local_25b8.data._M_elems[0x1b]._1_3_ = 0;
    local_25b8.exp = 0;
    local_25b8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_25b8,&local_2638,&local_2838);
    local_2838.fpclass = cpp_dec_float_finite;
    local_2838.prec_elem = 0x1c;
    local_2838.data._M_elems[0] = 0;
    local_2838.data._M_elems[1] = 0;
    local_2838.data._M_elems[2] = 0;
    local_2838.data._M_elems[3] = 0;
    local_2838.data._M_elems[4] = 0;
    local_2838.data._M_elems[5] = 0;
    local_2838.data._M_elems[6] = 0;
    local_2838.data._M_elems[7] = 0;
    local_2838.data._M_elems[8] = 0;
    local_2838.data._M_elems[9] = 0;
    local_2838.data._M_elems[10] = 0;
    local_2838.data._M_elems[0xb] = 0;
    local_2838.data._M_elems[0xc] = 0;
    local_2838.data._M_elems[0xd] = 0;
    local_2838.data._M_elems[0xe] = 0;
    local_2838.data._M_elems[0xf] = 0;
    local_2838.data._M_elems[0x10] = 0;
    local_2838.data._M_elems[0x11] = 0;
    local_2838.data._M_elems[0x12] = 0;
    local_2838.data._M_elems[0x13] = 0;
    local_2838.data._M_elems[0x14] = 0;
    local_2838.data._M_elems[0x15] = 0;
    local_2838.data._M_elems[0x16] = 0;
    local_2838.data._M_elems[0x17] = 0;
    local_2838.data._M_elems[0x18] = 0;
    local_2838.data._M_elems[0x19] = 0;
    local_2838.data._M_elems._104_5_ = 0;
    local_2838.data._M_elems[0x1b]._1_3_ = 0;
    local_2838.exp = 0;
    local_2838.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2838,
               &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_26b8);
    local_27b8.fpclass = cpp_dec_float_finite;
    local_27b8.prec_elem = 0x1c;
    local_27b8.data._M_elems[0] = 0;
    local_27b8.data._M_elems[1] = 0;
    local_27b8.data._M_elems[2] = 0;
    local_27b8.data._M_elems[3] = 0;
    local_27b8.data._M_elems[4] = 0;
    local_27b8.data._M_elems[5] = 0;
    local_27b8.data._M_elems[6] = 0;
    local_27b8.data._M_elems[7] = 0;
    local_27b8.data._M_elems[8] = 0;
    local_27b8.data._M_elems[9] = 0;
    local_27b8.data._M_elems[10] = 0;
    local_27b8.data._M_elems[0xb] = 0;
    local_27b8.data._M_elems[0xc] = 0;
    local_27b8.data._M_elems[0xd] = 0;
    local_27b8.data._M_elems[0xe] = 0;
    local_27b8.data._M_elems[0xf] = 0;
    local_27b8.data._M_elems[0x10] = 0;
    local_27b8.data._M_elems[0x11] = 0;
    local_27b8.data._M_elems[0x12] = 0;
    local_27b8.data._M_elems[0x13] = 0;
    local_27b8.data._M_elems[0x14] = 0;
    local_27b8.data._M_elems[0x15] = 0;
    local_27b8.data._M_elems[0x16] = 0;
    local_27b8.data._M_elems[0x17] = 0;
    local_27b8.data._M_elems[0x18] = 0;
    local_27b8.data._M_elems[0x19] = 0;
    local_27b8.data._M_elems._104_5_ = 0;
    local_27b8.data._M_elems[0x1b]._1_3_ = 0;
    local_27b8.exp = 0;
    local_27b8.neg = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_27b8,&pnVar19->m_backend,&local_26b8);
    local_2638.fpclass = cpp_dec_float_finite;
    local_2638.prec_elem = 0x1c;
    local_2638.data._M_elems[0] = 0;
    local_2638.data._M_elems[1] = 0;
    local_2638.data._M_elems[2] = 0;
    local_2638.data._M_elems[3] = 0;
    local_2638.data._M_elems[4] = 0;
    local_2638.data._M_elems[5] = 0;
    local_2638.data._M_elems[6] = 0;
    local_2638.data._M_elems[7] = 0;
    local_2638.data._M_elems[8] = 0;
    local_2638.data._M_elems[9] = 0;
    local_2638.data._M_elems[10] = 0;
    local_2638.data._M_elems[0xb] = 0;
    local_2638.data._M_elems[0xc] = 0;
    local_2638.data._M_elems[0xd] = 0;
    local_2638.data._M_elems[0xe] = 0;
    local_2638.data._M_elems[0xf] = 0;
    local_2638.data._M_elems[0x10] = 0;
    local_2638.data._M_elems[0x11] = 0;
    local_2638.data._M_elems[0x12] = 0;
    local_2638.data._M_elems[0x13] = 0;
    local_2638.data._M_elems[0x14] = 0;
    local_2638.data._M_elems[0x15] = 0;
    local_2638.data._M_elems[0x16] = 0;
    local_2638.data._M_elems[0x17] = 0;
    local_2638.data._M_elems[0x18] = 0;
    local_2638.data._M_elems[0x19] = 0;
    local_2638.data._M_elems._104_5_ = 0;
    local_2638.data._M_elems[0x1b]._1_3_ = 0;
    local_2638.exp = 0;
    local_2638.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2638,&local_2838,&local_27b8);
    pcVar6 = &local_25b8;
    pnVar18 = &local_eb0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pcVar6->data)._M_elems[0];
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar27 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    local_eb0.m_backend.exp = local_25b8.exp;
    local_eb0.m_backend.neg = local_25b8.neg;
    local_eb0.m_backend.fpclass = local_25b8.fpclass;
    local_eb0.m_backend.prec_elem = local_25b8.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_f30,this);
    bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_eb0,&local_f30);
    if (bVar4) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_25b8,0.0);
    }
    pcVar6 = &local_2638;
    pnVar18 = &local_fb0;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pcVar6->data)._M_elems[0];
      pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + ((ulong)bVar27 * -2 + 1) * 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar27 * -2 + 1) * 4);
    }
    local_fb0.m_backend.exp = local_2638.exp;
    local_fb0.m_backend.neg = local_2638.neg;
    local_fb0.m_backend.fpclass = local_2638.fpclass;
    local_fb0.m_backend.prec_elem = local_2638.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[7])(&local_1030,this);
    bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_fb0,&local_1030);
    if (bVar4) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_2638,0.0);
    }
    ::soplex::infinity::__tls_init();
    pnVar18 = &this->m_loJ;
    a = *(double *)(in_FS_OFFSET + -8);
    local_2838.fpclass = cpp_dec_float_finite;
    local_2838.prec_elem = 0x1c;
    local_2838.data._M_elems[0] = 0;
    local_2838.data._M_elems[1] = 0;
    local_2838.data._M_elems[2] = 0;
    local_2838.data._M_elems[3] = 0;
    local_2838.data._M_elems[4] = 0;
    local_2838.data._M_elems[5] = 0;
    local_2838.data._M_elems[6] = 0;
    local_2838.data._M_elems[7] = 0;
    local_2838.data._M_elems[8] = 0;
    local_2838.data._M_elems[9] = 0;
    local_2838.data._M_elems[10] = 0;
    local_2838.data._M_elems[0xb] = 0;
    local_2838.data._M_elems[0xc] = 0;
    local_2838.data._M_elems[0xd] = 0;
    local_2838.data._M_elems[0xe] = 0;
    local_2838.data._M_elems[0xf] = 0;
    local_2838.data._M_elems[0x10] = 0;
    local_2838.data._M_elems[0x11] = 0;
    local_2838.data._M_elems[0x12] = 0;
    local_2838.data._M_elems[0x13] = 0;
    local_2838.data._M_elems[0x14] = 0;
    local_2838.data._M_elems[0x15] = 0;
    local_2838.data._M_elems[0x16] = 0;
    local_2838.data._M_elems[0x17] = 0;
    local_2838.data._M_elems[0x18] = 0;
    local_2838.data._M_elems[0x19] = 0;
    local_2838.data._M_elems._104_5_ = 0;
    local_2838.data._M_elems[0x1b]._1_3_ = 0;
    local_2838.exp = 0;
    local_2838.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_2838,-a);
    if ((((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_2838.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&pnVar18->m_backend,&local_2838), iVar5 < 1)) {
      ::soplex::infinity::__tls_init();
      local_27b8.fpclass = cpp_dec_float_finite;
      local_27b8.prec_elem = 0x1c;
      local_27b8.data._M_elems[0] = 0;
      local_27b8.data._M_elems[1] = 0;
      local_27b8.data._M_elems[2] = 0;
      local_27b8.data._M_elems[3] = 0;
      local_27b8.data._M_elems[4] = 0;
      local_27b8.data._M_elems[5] = 0;
      local_27b8.data._M_elems[6] = 0;
      local_27b8.data._M_elems[7] = 0;
      local_27b8.data._M_elems[8] = 0;
      local_27b8.data._M_elems[9] = 0;
      local_27b8.data._M_elems[10] = 0;
      local_27b8.data._M_elems[0xb] = 0;
      local_27b8.data._M_elems[0xc] = 0;
      local_27b8.data._M_elems[0xd] = 0;
      local_27b8.data._M_elems[0xe] = 0;
      local_27b8.data._M_elems[0xf] = 0;
      local_27b8.data._M_elems[0x10] = 0;
      local_27b8.data._M_elems[0x11] = 0;
      local_27b8.data._M_elems[0x12] = 0;
      local_27b8.data._M_elems[0x13] = 0;
      local_27b8.data._M_elems[0x14] = 0;
      local_27b8.data._M_elems[0x15] = 0;
      local_27b8.data._M_elems[0x16] = 0;
      local_27b8.data._M_elems[0x17] = 0;
      local_27b8.data._M_elems[0x18] = 0;
      local_27b8.data._M_elems[0x19] = 0;
      local_27b8.data._M_elems._104_5_ = 0;
      local_27b8.data._M_elems[0x1b]._1_3_ = 0;
      local_27b8.exp = 0;
      local_27b8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&local_27b8,a);
      if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_27b8.fpclass != cpp_dec_float_NaN)) &&
         (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&(this->m_upJ).m_backend,&local_27b8), -1 < iVar5)) {
        ::soplex::infinity::__tls_init();
        local_24b8.fpclass = cpp_dec_float_finite;
        local_24b8.prec_elem = 0x1c;
        local_24b8.data._M_elems[0] = 0;
        local_24b8.data._M_elems[1] = 0;
        local_24b8.data._M_elems[2] = 0;
        local_24b8.data._M_elems[3] = 0;
        local_24b8.data._M_elems[4] = 0;
        local_24b8.data._M_elems[5] = 0;
        local_24b8.data._M_elems[6] = 0;
        local_24b8.data._M_elems[7] = 0;
        local_24b8.data._M_elems[8] = 0;
        local_24b8.data._M_elems[9] = 0;
        local_24b8.data._M_elems[10] = 0;
        local_24b8.data._M_elems[0xb] = 0;
        local_24b8.data._M_elems[0xc] = 0;
        local_24b8.data._M_elems[0xd] = 0;
        local_24b8.data._M_elems[0xe] = 0;
        local_24b8.data._M_elems[0xf] = 0;
        local_24b8.data._M_elems[0x10] = 0;
        local_24b8.data._M_elems[0x11] = 0;
        local_24b8.data._M_elems[0x12] = 0;
        local_24b8.data._M_elems[0x13] = 0;
        local_24b8.data._M_elems[0x14] = 0;
        local_24b8.data._M_elems[0x15] = 0;
        local_24b8.data._M_elems[0x16] = 0;
        local_24b8.data._M_elems[0x17] = 0;
        local_24b8.data._M_elems[0x18] = 0;
        local_24b8.data._M_elems[0x19] = 0;
        local_24b8.data._M_elems._104_5_ = 0;
        local_24b8.data._M_elems[0x1b]._1_3_ = 0;
        local_24b8.exp = 0;
        local_24b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_24b8,-a);
        if ((((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
            (local_24b8.fpclass != cpp_dec_float_NaN)) &&
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&pnVar16->m_backend,&local_24b8), iVar5 < 1)) {
          ::soplex::infinity::__tls_init();
          local_2538.fpclass = cpp_dec_float_finite;
          local_2538.prec_elem = 0x1c;
          local_2538.data._M_elems[0] = 0;
          local_2538.data._M_elems[1] = 0;
          local_2538.data._M_elems[2] = 0;
          local_2538.data._M_elems[3] = 0;
          local_2538.data._M_elems[4] = 0;
          local_2538.data._M_elems[5] = 0;
          local_2538.data._M_elems[6] = 0;
          local_2538.data._M_elems[7] = 0;
          local_2538.data._M_elems[8] = 0;
          local_2538.data._M_elems[9] = 0;
          local_2538.data._M_elems[10] = 0;
          local_2538.data._M_elems[0xb] = 0;
          local_2538.data._M_elems[0xc] = 0;
          local_2538.data._M_elems[0xd] = 0;
          local_2538.data._M_elems[0xe] = 0;
          local_2538.data._M_elems[0xf] = 0;
          local_2538.data._M_elems[0x10] = 0;
          local_2538.data._M_elems[0x11] = 0;
          local_2538.data._M_elems[0x12] = 0;
          local_2538.data._M_elems[0x13] = 0;
          local_2538.data._M_elems[0x14] = 0;
          local_2538.data._M_elems[0x15] = 0;
          local_2538.data._M_elems[0x16] = 0;
          local_2538.data._M_elems[0x17] = 0;
          local_2538.data._M_elems[0x18] = 0;
          local_2538.data._M_elems[0x19] = 0;
          local_2538.data._M_elems._104_5_ = 0;
          local_2538.data._M_elems[0x1b]._1_3_ = 0;
          local_2538.exp = 0;
          local_2538.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_2538,a);
          if ((((this->m_upK).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_2538.fpclass != cpp_dec_float_NaN)) &&
             (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&pnVar19->m_backend,&local_2538), -1 < iVar5)) {
            iVar5 = this->m_j;
            cStatus->data[iVar5] = ZERO;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)
                       ((x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar5),0.0);
            break;
          }
        }
      }
    }
    pnVar22 = &this->m_scale;
    local_2838.data._M_elems[0] = 0;
    local_2838.data._M_elems[1] = 0;
    tVar3 = boost::multiprecision::operator>(pnVar22,(double *)&local_2838);
    pnVar24 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_k;
    if (tVar3) {
      pnVar12 = pnVar24;
      pnVar17 = &local_23b8;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_23b8.m_backend.exp = (pnVar24->m_backend).exp;
      local_23b8.m_backend.neg = (pnVar24->m_backend).neg;
      local_23b8.m_backend.fpclass = (pnVar24->m_backend).fpclass;
      local_23b8.m_backend.prec_elem = (pnVar24->m_backend).prec_elem;
      pnVar17 = &this->m_upJ;
      local_2838.fpclass = cpp_dec_float_finite;
      local_2838.prec_elem = 0x1c;
      local_2838.data._M_elems[0] = 0;
      local_2838.data._M_elems[1] = 0;
      local_2838.data._M_elems[2] = 0;
      local_2838.data._M_elems[3] = 0;
      local_2838.data._M_elems[4] = 0;
      local_2838.data._M_elems[5] = 0;
      local_2838.data._M_elems[6] = 0;
      local_2838.data._M_elems[7] = 0;
      local_2838.data._M_elems[8] = 0;
      local_2838.data._M_elems[9] = 0;
      local_2838.data._M_elems[10] = 0;
      local_2838.data._M_elems[0xb] = 0;
      local_2838.data._M_elems[0xc] = 0;
      local_2838.data._M_elems[0xd] = 0;
      local_2838.data._M_elems[0xe] = 0;
      local_2838.data._M_elems[0xf] = 0;
      local_2838.data._M_elems[0x10] = 0;
      local_2838.data._M_elems[0x11] = 0;
      local_2838.data._M_elems[0x12] = 0;
      local_2838.data._M_elems[0x13] = 0;
      local_2838.data._M_elems[0x14] = 0;
      local_2838.data._M_elems[0x15] = 0;
      local_2838.data._M_elems[0x16] = 0;
      local_2838.data._M_elems[0x17] = 0;
      local_2838.data._M_elems[0x18] = 0;
      local_2838.data._M_elems[0x19] = 0;
      local_2838.data._M_elems._104_5_ = 0;
      VVar8 = ON_UPPER;
      local_2838.data._M_elems[0x1b]._1_3_ = 0;
      local_2838.exp = 0;
      local_2838.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_2838,&pnVar22->m_backend,&pnVar17->m_backend);
      local_1db8.fpclass = cpp_dec_float_finite;
      local_1db8.prec_elem = 0x1c;
      local_1db8.data._M_elems[0] = 0;
      local_1db8.data._M_elems[1] = 0;
      local_1db8.data._M_elems[2] = 0;
      local_1db8.data._M_elems[3] = 0;
      local_1db8.data._M_elems[4] = 0;
      local_1db8.data._M_elems[5] = 0;
      local_1db8.data._M_elems[6] = 0;
      local_1db8.data._M_elems[7] = 0;
      local_1db8.data._M_elems[8] = 0;
      local_1db8.data._M_elems[9] = 0;
      local_1db8.data._M_elems[10] = 0;
      local_1db8.data._M_elems[0xb] = 0;
      local_1db8.data._M_elems[0xc] = 0;
      local_1db8.data._M_elems[0xd] = 0;
      local_1db8.data._M_elems[0xe] = 0;
      local_1db8.data._M_elems[0xf] = 0;
      local_1db8.data._M_elems[0x10] = 0;
      local_1db8.data._M_elems[0x11] = 0;
      local_1db8.data._M_elems[0x12] = 0;
      local_1db8.data._M_elems[0x13] = 0;
      local_1db8.data._M_elems[0x14] = 0;
      local_1db8.data._M_elems[0x15] = 0;
      local_1db8.data._M_elems[0x16] = 0;
      local_1db8.data._M_elems[0x17] = 0;
      local_1db8.data._M_elems[0x18] = 0;
      local_1db8.data._M_elems[0x19] = 0;
      local_1db8.data._M_elems._104_5_ = 0;
      local_1db8.data._M_elems[0x1b]._1_3_ = 0;
      local_1db8.exp = 0;
      local_1db8.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_1db8,&pnVar19->m_backend,&local_2838);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_10b0,this);
      bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_23b8,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_1db8,&local_10b0);
      if (!bVar4) {
        iVar5 = this->m_k;
        pnVar24 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = pnVar24 + iVar5;
        pnVar23 = &local_1130;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar23->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar23 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_1130.m_backend.exp = pnVar24[iVar5].m_backend.exp;
        local_1130.m_backend.neg = pnVar24[iVar5].m_backend.neg;
        local_1130.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
        local_1130.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
        local_2838.fpclass = cpp_dec_float_finite;
        local_2838.prec_elem = 0x1c;
        local_2838.data._M_elems[0] = 0;
        local_2838.data._M_elems[1] = 0;
        local_2838.data._M_elems[2] = 0;
        local_2838.data._M_elems[3] = 0;
        local_2838.data._M_elems[4] = 0;
        local_2838.data._M_elems[5] = 0;
        local_2838.data._M_elems[6] = 0;
        local_2838.data._M_elems[7] = 0;
        local_2838.data._M_elems[8] = 0;
        local_2838.data._M_elems[9] = 0;
        local_2838.data._M_elems[10] = 0;
        local_2838.data._M_elems[0xb] = 0;
        local_2838.data._M_elems[0xc] = 0;
        local_2838.data._M_elems[0xd] = 0;
        local_2838.data._M_elems[0xe] = 0;
        local_2838.data._M_elems[0xf] = 0;
        local_2838.data._M_elems[0x10] = 0;
        local_2838.data._M_elems[0x11] = 0;
        local_2838.data._M_elems[0x12] = 0;
        local_2838.data._M_elems[0x13] = 0;
        local_2838.data._M_elems[0x14] = 0;
        local_2838.data._M_elems[0x15] = 0;
        local_2838.data._M_elems[0x16] = 0;
        local_2838.data._M_elems[0x17] = 0;
        local_2838.data._M_elems[0x18] = 0;
        local_2838.data._M_elems[0x19] = 0;
        local_2838.data._M_elems._104_5_ = 0;
        local_2838.data._M_elems[0x1b]._1_3_ = 0;
        local_2838.exp = 0;
        local_2838.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_2838,&pnVar22->m_backend,&pnVar17->m_backend);
        local_1e38.fpclass = cpp_dec_float_finite;
        local_1e38.prec_elem = 0x1c;
        local_1e38.data._M_elems[0] = 0;
        local_1e38.data._M_elems[1] = 0;
        local_1e38.data._M_elems[2] = 0;
        local_1e38.data._M_elems[3] = 0;
        local_1e38.data._M_elems[4] = 0;
        local_1e38.data._M_elems[5] = 0;
        local_1e38.data._M_elems[6] = 0;
        local_1e38.data._M_elems[7] = 0;
        local_1e38.data._M_elems[8] = 0;
        local_1e38.data._M_elems[9] = 0;
        local_1e38.data._M_elems[10] = 0;
        local_1e38.data._M_elems[0xb] = 0;
        local_1e38.data._M_elems[0xc] = 0;
        local_1e38.data._M_elems[0xd] = 0;
        local_1e38.data._M_elems[0xe] = 0;
        local_1e38.data._M_elems[0xf] = 0;
        local_1e38.data._M_elems[0x10] = 0;
        local_1e38.data._M_elems[0x11] = 0;
        local_1e38.data._M_elems[0x12] = 0;
        local_1e38.data._M_elems[0x13] = 0;
        local_1e38.data._M_elems[0x14] = 0;
        local_1e38.data._M_elems[0x15] = 0;
        local_1e38.data._M_elems[0x16] = 0;
        local_1e38.data._M_elems[0x17] = 0;
        local_1e38.data._M_elems[0x18] = 0;
        local_1e38.data._M_elems[0x19] = 0;
        local_1e38.data._M_elems._104_5_ = 0;
        local_1e38.data._M_elems[0x1b]._1_3_ = 0;
        local_1e38.exp = 0;
        local_1e38.neg = false;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_1e38,&pnVar16->m_backend,&local_2838);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_11b0,this);
        bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1130,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_1e38,&local_11b0);
        if (!bVar4) {
LAB_0058deea:
          iVar5 = this->m_k;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          pnVar17 = &local_1230;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1230.m_backend.exp = pnVar24[iVar5].m_backend.exp;
          local_1230.m_backend.neg = pnVar24[iVar5].m_backend.neg;
          local_1230.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
          local_1230.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
          local_2838.fpclass = cpp_dec_float_finite;
          local_2838.prec_elem = 0x1c;
          local_2838.data._M_elems[0] = 0;
          local_2838.data._M_elems[1] = 0;
          local_2838.data._M_elems[2] = 0;
          local_2838.data._M_elems[3] = 0;
          local_2838.data._M_elems[4] = 0;
          local_2838.data._M_elems[5] = 0;
          local_2838.data._M_elems[6] = 0;
          local_2838.data._M_elems[7] = 0;
          local_2838.data._M_elems[8] = 0;
          local_2838.data._M_elems[9] = 0;
          local_2838.data._M_elems[10] = 0;
          local_2838.data._M_elems[0xb] = 0;
          local_2838.data._M_elems[0xc] = 0;
          local_2838.data._M_elems[0xd] = 0;
          local_2838.data._M_elems[0xe] = 0;
          local_2838.data._M_elems[0xf] = 0;
          local_2838.data._M_elems[0x10] = 0;
          local_2838.data._M_elems[0x11] = 0;
          local_2838.data._M_elems[0x12] = 0;
          local_2838.data._M_elems[0x13] = 0;
          local_2838.data._M_elems[0x14] = 0;
          local_2838.data._M_elems[0x15] = 0;
          local_2838.data._M_elems[0x16] = 0;
          local_2838.data._M_elems[0x17] = 0;
          local_2838.data._M_elems[0x18] = 0;
          local_2838.data._M_elems[0x19] = 0;
          local_2838.data._M_elems._104_5_ = 0;
          local_2838.data._M_elems[0x1b]._1_3_ = 0;
          local_2838.exp = 0;
          local_2838.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2838,&pnVar22->m_backend,&pnVar18->m_backend);
          local_1eb8.fpclass = cpp_dec_float_finite;
          local_1eb8.prec_elem = 0x1c;
          local_1eb8.data._M_elems[0] = 0;
          local_1eb8.data._M_elems[1] = 0;
          local_1eb8.data._M_elems[2] = 0;
          local_1eb8.data._M_elems[3] = 0;
          local_1eb8.data._M_elems[4] = 0;
          local_1eb8.data._M_elems[5] = 0;
          local_1eb8.data._M_elems[6] = 0;
          local_1eb8.data._M_elems[7] = 0;
          local_1eb8.data._M_elems[8] = 0;
          local_1eb8.data._M_elems[9] = 0;
          local_1eb8.data._M_elems[10] = 0;
          local_1eb8.data._M_elems[0xb] = 0;
          local_1eb8.data._M_elems[0xc] = 0;
          local_1eb8.data._M_elems[0xd] = 0;
          local_1eb8.data._M_elems[0xe] = 0;
          local_1eb8.data._M_elems[0xf] = 0;
          local_1eb8.data._M_elems[0x10] = 0;
          local_1eb8.data._M_elems[0x11] = 0;
          local_1eb8.data._M_elems[0x12] = 0;
          local_1eb8.data._M_elems[0x13] = 0;
          local_1eb8.data._M_elems[0x14] = 0;
          local_1eb8.data._M_elems[0x15] = 0;
          local_1eb8.data._M_elems[0x16] = 0;
          local_1eb8.data._M_elems[0x17] = 0;
          local_1eb8.data._M_elems[0x18] = 0;
          local_1eb8.data._M_elems[0x19] = 0;
          local_1eb8.data._M_elems._104_5_ = 0;
          local_1eb8.data._M_elems[0x1b]._1_3_ = 0;
          local_1eb8.exp = 0;
          local_1eb8.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_1eb8,&pnVar19->m_backend,&local_2838);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_12b0,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1230,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1eb8,&local_12b0);
          if (bVar4) {
            ::soplex::infinity::__tls_init();
            local_27b8.fpclass = cpp_dec_float_finite;
            local_27b8.prec_elem = 0x1c;
            local_27b8.data._M_elems[0] = 0;
            local_27b8.data._M_elems[1] = 0;
            local_27b8.data._M_elems[2] = 0;
            local_27b8.data._M_elems[3] = 0;
            local_27b8.data._M_elems[4] = 0;
            local_27b8.data._M_elems[5] = 0;
            local_27b8.data._M_elems[6] = 0;
            local_27b8.data._M_elems[7] = 0;
            local_27b8.data._M_elems[8] = 0;
            local_27b8.data._M_elems[9] = 0;
            local_27b8.data._M_elems[10] = 0;
            local_27b8.data._M_elems[0xb] = 0;
            local_27b8.data._M_elems[0xc] = 0;
            local_27b8.data._M_elems[0xd] = 0;
            local_27b8.data._M_elems[0xe] = 0;
            local_27b8.data._M_elems[0xf] = 0;
            local_27b8.data._M_elems[0x10] = 0;
            local_27b8.data._M_elems[0x11] = 0;
            local_27b8.data._M_elems[0x12] = 0;
            local_27b8.data._M_elems[0x13] = 0;
            local_27b8.data._M_elems[0x14] = 0;
            local_27b8.data._M_elems[0x15] = 0;
            local_27b8.data._M_elems[0x16] = 0;
            local_27b8.data._M_elems[0x17] = 0;
            local_27b8.data._M_elems[0x18] = 0;
            local_27b8.data._M_elems[0x19] = 0;
            local_27b8.data._M_elems._104_5_ = 0;
            local_27b8.data._M_elems[0x1b]._1_3_ = 0;
            local_27b8.exp = 0;
            local_27b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_27b8,a);
            if ((((this->m_upK).m_backend.fpclass != cpp_dec_float_NaN) &&
                (local_27b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&pnVar19->m_backend,&local_27b8), iVar5 < 0)) goto LAB_0058e20e;
          }
          iVar5 = this->m_k;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          pnVar17 = &local_1330;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1330.m_backend.exp = pnVar24[iVar5].m_backend.exp;
          local_1330.m_backend.neg = pnVar24[iVar5].m_backend.neg;
          local_1330.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
          local_1330.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
          local_2838.fpclass = cpp_dec_float_finite;
          local_2838.prec_elem = 0x1c;
          local_2838.data._M_elems[0] = 0;
          local_2838.data._M_elems[1] = 0;
          local_2838.data._M_elems[2] = 0;
          local_2838.data._M_elems[3] = 0;
          local_2838.data._M_elems[4] = 0;
          local_2838.data._M_elems[5] = 0;
          local_2838.data._M_elems[6] = 0;
          local_2838.data._M_elems[7] = 0;
          local_2838.data._M_elems[8] = 0;
          local_2838.data._M_elems[9] = 0;
          local_2838.data._M_elems[10] = 0;
          local_2838.data._M_elems[0xb] = 0;
          local_2838.data._M_elems[0xc] = 0;
          local_2838.data._M_elems[0xd] = 0;
          local_2838.data._M_elems[0xe] = 0;
          local_2838.data._M_elems[0xf] = 0;
          local_2838.data._M_elems[0x10] = 0;
          local_2838.data._M_elems[0x11] = 0;
          local_2838.data._M_elems[0x12] = 0;
          local_2838.data._M_elems[0x13] = 0;
          local_2838.data._M_elems[0x14] = 0;
          local_2838.data._M_elems[0x15] = 0;
          local_2838.data._M_elems[0x16] = 0;
          local_2838.data._M_elems[0x17] = 0;
          local_2838.data._M_elems[0x18] = 0;
          local_2838.data._M_elems[0x19] = 0;
          local_2838.data._M_elems._104_5_ = 0;
          local_2838.data._M_elems[0x1b]._1_3_ = 0;
          local_2838.exp = 0;
          local_2838.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2838,&pnVar22->m_backend,&pnVar18->m_backend);
          local_1f38.fpclass = cpp_dec_float_finite;
          local_1f38.prec_elem = 0x1c;
          local_1f38.data._M_elems[0] = 0;
          local_1f38.data._M_elems[1] = 0;
          local_1f38.data._M_elems[2] = 0;
          local_1f38.data._M_elems[3] = 0;
          local_1f38.data._M_elems[4] = 0;
          local_1f38.data._M_elems[5] = 0;
          local_1f38.data._M_elems[6] = 0;
          local_1f38.data._M_elems[7] = 0;
          local_1f38.data._M_elems[8] = 0;
          local_1f38.data._M_elems[9] = 0;
          local_1f38.data._M_elems[10] = 0;
          local_1f38.data._M_elems[0xb] = 0;
          local_1f38.data._M_elems[0xc] = 0;
          local_1f38.data._M_elems[0xd] = 0;
          local_1f38.data._M_elems[0xe] = 0;
          local_1f38.data._M_elems[0xf] = 0;
          local_1f38.data._M_elems[0x10] = 0;
          local_1f38.data._M_elems[0x11] = 0;
          local_1f38.data._M_elems[0x12] = 0;
          local_1f38.data._M_elems[0x13] = 0;
          local_1f38.data._M_elems[0x14] = 0;
          local_1f38.data._M_elems[0x15] = 0;
          local_1f38.data._M_elems[0x16] = 0;
          local_1f38.data._M_elems[0x17] = 0;
          local_1f38.data._M_elems[0x18] = 0;
          local_1f38.data._M_elems[0x19] = 0;
          local_1f38.data._M_elems._104_5_ = 0;
          local_1f38.data._M_elems[0x1b]._1_3_ = 0;
          local_1f38.exp = 0;
          local_1f38.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_1f38,&pnVar16->m_backend,&local_2838);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_13b0,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1330,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1f38,&local_13b0);
          if (bVar4) {
            ::soplex::infinity::__tls_init();
            local_27b8.fpclass = cpp_dec_float_finite;
            local_27b8.prec_elem = 0x1c;
            local_27b8.data._M_elems[0] = 0;
            local_27b8.data._M_elems[1] = 0;
            local_27b8.data._M_elems[2] = 0;
            local_27b8.data._M_elems[3] = 0;
            local_27b8.data._M_elems[4] = 0;
            local_27b8.data._M_elems[5] = 0;
            local_27b8.data._M_elems[6] = 0;
            local_27b8.data._M_elems[7] = 0;
            local_27b8.data._M_elems[8] = 0;
            local_27b8.data._M_elems[9] = 0;
            local_27b8.data._M_elems[10] = 0;
            local_27b8.data._M_elems[0xb] = 0;
            local_27b8.data._M_elems[0xc] = 0;
            local_27b8.data._M_elems[0xd] = 0;
            local_27b8.data._M_elems[0xe] = 0;
            local_27b8.data._M_elems[0xf] = 0;
            local_27b8.data._M_elems[0x10] = 0;
            local_27b8.data._M_elems[0x11] = 0;
            local_27b8.data._M_elems[0x12] = 0;
            local_27b8.data._M_elems[0x13] = 0;
            local_27b8.data._M_elems[0x14] = 0;
            local_27b8.data._M_elems[0x15] = 0;
            local_27b8.data._M_elems[0x16] = 0;
            local_27b8.data._M_elems[0x17] = 0;
            local_27b8.data._M_elems[0x18] = 0;
            local_27b8.data._M_elems[0x19] = 0;
            local_27b8.data._M_elems._104_5_ = 0;
            local_27b8.data._M_elems[0x1b]._1_3_ = 0;
            local_27b8.exp = 0;
            local_27b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_27b8,-a);
            if ((((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
                (local_27b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&pnVar18->m_backend,&local_27b8), 0 < iVar5)) {
              if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0058ed14;
              fVar1 = (this->m_upJ).m_backend.fpclass;
              goto joined_r0x0058d7ad;
            }
          }
          iVar5 = this->m_k;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          pnVar17 = &local_1430;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1430.m_backend.exp = pnVar24[iVar5].m_backend.exp;
          local_1430.m_backend.neg = pnVar24[iVar5].m_backend.neg;
          local_1430.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
          local_1430.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
          local_2838.fpclass = cpp_dec_float_finite;
          local_2838.prec_elem = 0x1c;
          local_2838.data._M_elems[0] = 0;
          local_2838.data._M_elems[1] = 0;
          local_2838.data._M_elems[2] = 0;
          local_2838.data._M_elems[3] = 0;
          local_2838.data._M_elems[4] = 0;
          local_2838.data._M_elems[5] = 0;
          local_2838.data._M_elems[6] = 0;
          local_2838.data._M_elems[7] = 0;
          local_2838.data._M_elems[8] = 0;
          local_2838.data._M_elems[9] = 0;
          local_2838.data._M_elems[10] = 0;
          local_2838.data._M_elems[0xb] = 0;
          local_2838.data._M_elems[0xc] = 0;
          local_2838.data._M_elems[0xd] = 0;
          local_2838.data._M_elems[0xe] = 0;
          local_2838.data._M_elems[0xf] = 0;
          local_2838.data._M_elems[0x10] = 0;
          local_2838.data._M_elems[0x11] = 0;
          local_2838.data._M_elems[0x12] = 0;
          local_2838.data._M_elems[0x13] = 0;
          local_2838.data._M_elems[0x14] = 0;
          local_2838.data._M_elems[0x15] = 0;
          local_2838.data._M_elems[0x16] = 0;
          local_2838.data._M_elems[0x17] = 0;
          local_2838.data._M_elems[0x18] = 0;
          local_2838.data._M_elems[0x19] = 0;
          local_2838.data._M_elems._104_5_ = 0;
          local_2838.data._M_elems[0x1b]._1_3_ = 0;
          local_2838.exp = 0;
          local_2838.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2838,&pnVar22->m_backend,&pnVar18->m_backend);
          local_1fb8.fpclass = cpp_dec_float_finite;
          local_1fb8.prec_elem = 0x1c;
          local_1fb8.data._M_elems[0] = 0;
          local_1fb8.data._M_elems[1] = 0;
          local_1fb8.data._M_elems[2] = 0;
          local_1fb8.data._M_elems[3] = 0;
          local_1fb8.data._M_elems[4] = 0;
          local_1fb8.data._M_elems[5] = 0;
          local_1fb8.data._M_elems[6] = 0;
          local_1fb8.data._M_elems[7] = 0;
          local_1fb8.data._M_elems[8] = 0;
          local_1fb8.data._M_elems[9] = 0;
          local_1fb8.data._M_elems[10] = 0;
          local_1fb8.data._M_elems[0xb] = 0;
          local_1fb8.data._M_elems[0xc] = 0;
          local_1fb8.data._M_elems[0xd] = 0;
          local_1fb8.data._M_elems[0xe] = 0;
          local_1fb8.data._M_elems[0xf] = 0;
          local_1fb8.data._M_elems[0x10] = 0;
          local_1fb8.data._M_elems[0x11] = 0;
          local_1fb8.data._M_elems[0x12] = 0;
          local_1fb8.data._M_elems[0x13] = 0;
          local_1fb8.data._M_elems[0x14] = 0;
          local_1fb8.data._M_elems[0x15] = 0;
          local_1fb8.data._M_elems[0x16] = 0;
          local_1fb8.data._M_elems[0x17] = 0;
          local_1fb8.data._M_elems[0x18] = 0;
          local_1fb8.data._M_elems[0x19] = 0;
          local_1fb8.data._M_elems._104_5_ = 0;
          local_1fb8.data._M_elems[0x1b]._1_3_ = 0;
          local_1fb8.exp = 0;
          local_1fb8.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_1fb8,&pnVar16->m_backend,&local_2838);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_14b0,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1430,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_1fb8,&local_14b0);
          if (bVar4) {
            ::soplex::infinity::__tls_init();
            local_27b8.fpclass = cpp_dec_float_finite;
            local_27b8.prec_elem = 0x1c;
            local_27b8.data._M_elems[0] = 0;
            local_27b8.data._M_elems[1] = 0;
            local_27b8.data._M_elems[2] = 0;
            local_27b8.data._M_elems[3] = 0;
            local_27b8.data._M_elems[4] = 0;
            local_27b8.data._M_elems[5] = 0;
            local_27b8.data._M_elems[6] = 0;
            local_27b8.data._M_elems[7] = 0;
            local_27b8.data._M_elems[8] = 0;
            local_27b8.data._M_elems[9] = 0;
            local_27b8.data._M_elems[10] = 0;
            local_27b8.data._M_elems[0xb] = 0;
            local_27b8.data._M_elems[0xc] = 0;
            local_27b8.data._M_elems[0xd] = 0;
            local_27b8.data._M_elems[0xe] = 0;
            local_27b8.data._M_elems[0xf] = 0;
            local_27b8.data._M_elems[0x10] = 0;
            local_27b8.data._M_elems[0x11] = 0;
            local_27b8.data._M_elems[0x12] = 0;
            local_27b8.data._M_elems[0x13] = 0;
            local_27b8.data._M_elems[0x14] = 0;
            local_27b8.data._M_elems[0x15] = 0;
            local_27b8.data._M_elems[0x16] = 0;
            local_27b8.data._M_elems[0x17] = 0;
            local_27b8.data._M_elems[0x18] = 0;
            local_27b8.data._M_elems[0x19] = 0;
            local_27b8.data._M_elems._104_5_ = 0;
            local_27b8.data._M_elems[0x1b]._1_3_ = 0;
            local_27b8.exp = 0;
            local_27b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_27b8,-a);
            if ((((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
                (local_27b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&pnVar16->m_backend,&local_27b8), 0 < iVar5)) {
              VVar8 = ON_LOWER;
              if ((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) {
                fVar1 = (this->m_upK).m_backend.fpclass;
joined_r0x0058e941:
                VVar8 = ON_LOWER;
                if (fVar1 != cpp_dec_float_NaN) {
                  iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                    (&pnVar16->m_backend,&pnVar19->m_backend);
                  VVar8 = (iVar5 == 0) + ON_LOWER;
                }
              }
              goto LAB_0058e95a;
            }
          }
          iVar5 = this->m_k;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          pnVar19 = &local_1530;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1530.m_backend.exp = pnVar24[iVar5].m_backend.exp;
          local_1530.m_backend.neg = pnVar24[iVar5].m_backend.neg;
          local_1530.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
          local_1530.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
          local_2838.fpclass = cpp_dec_float_finite;
          local_2838.prec_elem = 0x1c;
          local_2838.data._M_elems[0] = 0;
          local_2838.data._M_elems[1] = 0;
          local_2838.data._M_elems[2] = 0;
          local_2838.data._M_elems[3] = 0;
          local_2838.data._M_elems[4] = 0;
          local_2838.data._M_elems[5] = 0;
          local_2838.data._M_elems[6] = 0;
          local_2838.data._M_elems[7] = 0;
          local_2838.data._M_elems[8] = 0;
          local_2838.data._M_elems[9] = 0;
          local_2838.data._M_elems[10] = 0;
          local_2838.data._M_elems[0xb] = 0;
          local_2838.data._M_elems[0xc] = 0;
          local_2838.data._M_elems[0xd] = 0;
          local_2838.data._M_elems[0xe] = 0;
          local_2838.data._M_elems[0xf] = 0;
          local_2838.data._M_elems[0x10] = 0;
          local_2838.data._M_elems[0x11] = 0;
          local_2838.data._M_elems[0x12] = 0;
          local_2838.data._M_elems[0x13] = 0;
          local_2838.data._M_elems[0x14] = 0;
          local_2838.data._M_elems[0x15] = 0;
          local_2838.data._M_elems[0x16] = 0;
          local_2838.data._M_elems[0x17] = 0;
          local_2838.data._M_elems[0x18] = 0;
          local_2838.data._M_elems[0x19] = 0;
          local_2838.data._M_elems._104_5_ = 0;
          local_2838.data._M_elems[0x1b]._1_3_ = 0;
          local_2838.exp = 0;
          local_2838.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2838,&pnVar22->m_backend,&pnVar18->m_backend);
          local_2038.fpclass = cpp_dec_float_finite;
          local_2038.prec_elem = 0x1c;
          local_2038.data._M_elems[0] = 0;
          local_2038.data._M_elems[1] = 0;
          local_2038.data._M_elems[2] = 0;
          local_2038.data._M_elems[3] = 0;
          local_2038.data._M_elems[4] = 0;
          local_2038.data._M_elems[5] = 0;
          local_2038.data._M_elems[6] = 0;
          local_2038.data._M_elems[7] = 0;
          local_2038.data._M_elems[8] = 0;
          local_2038.data._M_elems[9] = 0;
          local_2038.data._M_elems[10] = 0;
          local_2038.data._M_elems[0xb] = 0;
          local_2038.data._M_elems[0xc] = 0;
          local_2038.data._M_elems[0xd] = 0;
          local_2038.data._M_elems[0xe] = 0;
          local_2038.data._M_elems[0xf] = 0;
          local_2038.data._M_elems[0x10] = 0;
          local_2038.data._M_elems[0x11] = 0;
          local_2038.data._M_elems[0x12] = 0;
          local_2038.data._M_elems[0x13] = 0;
          local_2038.data._M_elems[0x14] = 0;
          local_2038.data._M_elems[0x15] = 0;
          local_2038.data._M_elems[0x16] = 0;
          local_2038.data._M_elems[0x17] = 0;
          local_2038.data._M_elems[0x18] = 0;
          local_2038.data._M_elems[0x19] = 0;
          local_2038.data._M_elems._104_5_ = 0;
          local_2038.data._M_elems[0x1b]._1_3_ = 0;
          local_2038.exp = 0;
          local_2038.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2038,&pnVar16->m_backend,&local_2838);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_15b0,this);
          bVar4 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1530,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_2038,&local_15b0);
          if (!bVar4) {
            puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_2838.data._M_elems._0_8_ = local_2838.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_2838,"XMAISM08 This should never happen.","");
            *puVar7 = &PTR__SPxException_006a9ee8;
            puVar7[1] = puVar7 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar7 + 1),local_2838.data._M_elems._0_8_,
                       local_2838.data._M_elems._0_8_ + local_2838.data._M_elems._8_8_);
            *puVar7 = &PTR__SPxException_006a9ec0;
            __cxa_throw(puVar7,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0058ed14;
          fVar1 = (this->m_upJ).m_backend.fpclass;
joined_r0x0058d7ad:
          VVar8 = ON_LOWER;
          if (fVar1 != cpp_dec_float_NaN) {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&pnVar18->m_backend,&(this->m_upJ).m_backend);
            VVar8 = (iVar5 == 0) + ON_LOWER;
          }
          goto LAB_0058ed23;
        }
        ::soplex::infinity::__tls_init();
        local_27b8.fpclass = cpp_dec_float_finite;
        local_27b8.prec_elem = 0x1c;
        local_27b8.data._M_elems[0] = 0;
        local_27b8.data._M_elems[1] = 0;
        local_27b8.data._M_elems[2] = 0;
        local_27b8.data._M_elems[3] = 0;
        local_27b8.data._M_elems[4] = 0;
        local_27b8.data._M_elems[5] = 0;
        local_27b8.data._M_elems[6] = 0;
        local_27b8.data._M_elems[7] = 0;
        local_27b8.data._M_elems[8] = 0;
        local_27b8.data._M_elems[9] = 0;
        local_27b8.data._M_elems[10] = 0;
        local_27b8.data._M_elems[0xb] = 0;
        local_27b8.data._M_elems[0xc] = 0;
        local_27b8.data._M_elems[0xd] = 0;
        local_27b8.data._M_elems[0xe] = 0;
        local_27b8.data._M_elems[0xf] = 0;
        local_27b8.data._M_elems[0x10] = 0;
        local_27b8.data._M_elems[0x11] = 0;
        local_27b8.data._M_elems[0x12] = 0;
        local_27b8.data._M_elems[0x13] = 0;
        local_27b8.data._M_elems[0x14] = 0;
        local_27b8.data._M_elems[0x15] = 0;
        local_27b8.data._M_elems[0x16] = 0;
        local_27b8.data._M_elems[0x17] = 0;
        local_27b8.data._M_elems[0x18] = 0;
        local_27b8.data._M_elems[0x19] = 0;
        local_27b8.data._M_elems._104_5_ = 0;
        local_27b8.data._M_elems[0x1b]._1_3_ = 0;
        local_27b8.exp = 0;
        local_27b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&local_27b8,a);
        if ((((this->m_upJ).m_backend.fpclass == cpp_dec_float_NaN) ||
            (local_27b8.fpclass == cpp_dec_float_NaN)) ||
           (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&pnVar17->m_backend,&local_27b8), -1 < iVar5)) goto LAB_0058deea;
        VVar8 = ON_UPPER;
        if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
           (VVar8 = ON_UPPER, (this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar18->m_backend,&pnVar17->m_backend);
          VVar8 = (uint)(iVar5 == 0) * 2;
        }
        lVar26 = (long)this->m_j;
        cStatus->data[lVar26] = VVar8;
        pnVar12 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar11 = lVar26 * 0x80;
        lVar25 = 0x1c;
        pnVar24 = pnVar12 + lVar26;
LAB_0058f03f:
        for (; lVar25 != 0; lVar25 = lVar25 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + (ulong)bVar27 * -8 + 4);
          pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        *(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar11) = (this->m_upJ).m_backend.exp;
        *(bool *)((long)(&(pnVar12->m_backend).data + 1) + lVar11 + 4U) =
             (this->m_upJ).m_backend.neg;
        uVar10._0_4_ = (this->m_upJ).m_backend.fpclass;
        uVar10._4_4_ = (this->m_upJ).m_backend.prec_elem;
        goto LAB_0058ed61;
      }
      if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
         ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
        iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&pnVar18->m_backend,&pnVar17->m_backend);
        VVar8 = (uint)(iVar5 == 0) * 2;
      }
      lVar26 = (long)this->m_j;
      cStatus->data[lVar26] = VVar8;
      pnVar12 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar25 = lVar26 * 0x80;
      lVar11 = 0x1c;
      pnVar24 = pnVar12 + lVar26;
LAB_0058ec9a:
      for (; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + (ulong)bVar27 * -8 + 4);
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      *(int *)((long)(&(pnVar12->m_backend).data + 1) + lVar25) = (this->m_upJ).m_backend.exp;
      *(bool *)((long)(&(pnVar12->m_backend).data + 1) + lVar25 + 4U) = (this->m_upJ).m_backend.neg;
      *(undefined8 *)((long)(&(pnVar12->m_backend).data + 1) + lVar25 + 8U) =
           *(undefined8 *)&(this->m_upJ).m_backend.fpclass;
      pcVar6 = &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    }
    else {
      pnVar12 = pnVar24;
      pnVar17 = &local_1630;
      for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      local_1630.m_backend.exp = (pnVar24->m_backend).exp;
      local_1630.m_backend.neg = (pnVar24->m_backend).neg;
      local_1630.m_backend.fpclass = (pnVar24->m_backend).fpclass;
      local_1630.m_backend.prec_elem = (pnVar24->m_backend).prec_elem;
      local_2838.fpclass = cpp_dec_float_finite;
      local_2838.prec_elem = 0x1c;
      local_2838.data._M_elems[0] = 0;
      local_2838.data._M_elems[1] = 0;
      local_2838.data._M_elems[2] = 0;
      local_2838.data._M_elems[3] = 0;
      local_2838.data._M_elems[4] = 0;
      local_2838.data._M_elems[5] = 0;
      local_2838.data._M_elems[6] = 0;
      local_2838.data._M_elems[7] = 0;
      local_2838.data._M_elems[8] = 0;
      local_2838.data._M_elems[9] = 0;
      local_2838.data._M_elems[10] = 0;
      local_2838.data._M_elems[0xb] = 0;
      local_2838.data._M_elems[0xc] = 0;
      local_2838.data._M_elems[0xd] = 0;
      local_2838.data._M_elems[0xe] = 0;
      local_2838.data._M_elems[0xf] = 0;
      local_2838.data._M_elems[0x10] = 0;
      local_2838.data._M_elems[0x11] = 0;
      local_2838.data._M_elems[0x12] = 0;
      local_2838.data._M_elems[0x13] = 0;
      local_2838.data._M_elems[0x14] = 0;
      local_2838.data._M_elems[0x15] = 0;
      local_2838.data._M_elems[0x16] = 0;
      local_2838.data._M_elems[0x17] = 0;
      local_2838.data._M_elems[0x18] = 0;
      local_2838.data._M_elems[0x19] = 0;
      local_2838.data._M_elems._104_5_ = 0;
      local_2838.data._M_elems[0x1b]._1_3_ = 0;
      local_2838.exp = 0;
      local_2838.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_2838,&pnVar22->m_backend,&pnVar18->m_backend);
      local_20b8.fpclass = cpp_dec_float_finite;
      local_20b8.prec_elem = 0x1c;
      local_20b8.data._M_elems[0] = 0;
      local_20b8.data._M_elems[1] = 0;
      local_20b8.data._M_elems[2] = 0;
      local_20b8.data._M_elems[3] = 0;
      local_20b8.data._M_elems[4] = 0;
      local_20b8.data._M_elems[5] = 0;
      local_20b8.data._M_elems[6] = 0;
      local_20b8.data._M_elems[7] = 0;
      local_20b8.data._M_elems[8] = 0;
      local_20b8.data._M_elems[9] = 0;
      local_20b8.data._M_elems[10] = 0;
      local_20b8.data._M_elems[0xb] = 0;
      local_20b8.data._M_elems[0xc] = 0;
      local_20b8.data._M_elems[0xd] = 0;
      local_20b8.data._M_elems[0xe] = 0;
      local_20b8.data._M_elems[0xf] = 0;
      local_20b8.data._M_elems[0x10] = 0;
      local_20b8.data._M_elems[0x11] = 0;
      local_20b8.data._M_elems[0x12] = 0;
      local_20b8.data._M_elems[0x13] = 0;
      local_20b8.data._M_elems[0x14] = 0;
      local_20b8.data._M_elems[0x15] = 0;
      local_20b8.data._M_elems[0x16] = 0;
      local_20b8.data._M_elems[0x17] = 0;
      local_20b8.data._M_elems[0x18] = 0;
      local_20b8.data._M_elems[0x19] = 0;
      local_20b8.data._M_elems._104_5_ = 0;
      local_20b8.data._M_elems[0x1b]._1_3_ = 0;
      local_20b8.exp = 0;
      local_20b8.neg = false;
      boost::multiprecision::default_ops::
      eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&local_20b8,&pnVar19->m_backend,&local_2838);
      (*(this->super_PostStep)._vptr_PostStep[7])(&local_16b0,this);
      bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_1630,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_20b8,&local_16b0);
      if (!bVar4) {
        iVar5 = this->m_k;
        pnVar24 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = pnVar24 + iVar5;
        pnVar17 = &local_1730;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_1730.m_backend.exp = pnVar24[iVar5].m_backend.exp;
        local_1730.m_backend.neg = pnVar24[iVar5].m_backend.neg;
        local_1730.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
        local_1730.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
        local_2838.fpclass = cpp_dec_float_finite;
        local_2838.prec_elem = 0x1c;
        local_2838.data._M_elems[0] = 0;
        local_2838.data._M_elems[1] = 0;
        local_2838.data._M_elems[2] = 0;
        local_2838.data._M_elems[3] = 0;
        local_2838.data._M_elems[4] = 0;
        local_2838.data._M_elems[5] = 0;
        local_2838.data._M_elems[6] = 0;
        local_2838.data._M_elems[7] = 0;
        local_2838.data._M_elems[8] = 0;
        local_2838.data._M_elems[9] = 0;
        local_2838.data._M_elems[10] = 0;
        local_2838.data._M_elems[0xb] = 0;
        local_2838.data._M_elems[0xc] = 0;
        local_2838.data._M_elems[0xd] = 0;
        local_2838.data._M_elems[0xe] = 0;
        local_2838.data._M_elems[0xf] = 0;
        local_2838.data._M_elems[0x10] = 0;
        local_2838.data._M_elems[0x11] = 0;
        local_2838.data._M_elems[0x12] = 0;
        local_2838.data._M_elems[0x13] = 0;
        local_2838.data._M_elems[0x14] = 0;
        local_2838.data._M_elems[0x15] = 0;
        local_2838.data._M_elems[0x16] = 0;
        local_2838.data._M_elems[0x17] = 0;
        local_2838.data._M_elems[0x18] = 0;
        local_2838.data._M_elems[0x19] = 0;
        local_2838.data._M_elems._104_5_ = 0;
        local_2838.data._M_elems[0x1b]._1_3_ = 0;
        local_2838.exp = 0;
        local_2838.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_2838,&pnVar22->m_backend,&pnVar18->m_backend);
        local_2138.fpclass = cpp_dec_float_finite;
        local_2138.prec_elem = 0x1c;
        local_2138.data._M_elems[0] = 0;
        local_2138.data._M_elems[1] = 0;
        local_2138.data._M_elems[2] = 0;
        local_2138.data._M_elems[3] = 0;
        local_2138.data._M_elems[4] = 0;
        local_2138.data._M_elems[5] = 0;
        local_2138.data._M_elems[6] = 0;
        local_2138.data._M_elems[7] = 0;
        local_2138.data._M_elems[8] = 0;
        local_2138.data._M_elems[9] = 0;
        local_2138.data._M_elems[10] = 0;
        local_2138.data._M_elems[0xb] = 0;
        local_2138.data._M_elems[0xc] = 0;
        local_2138.data._M_elems[0xd] = 0;
        local_2138.data._M_elems[0xe] = 0;
        local_2138.data._M_elems[0xf] = 0;
        local_2138.data._M_elems[0x10] = 0;
        local_2138.data._M_elems[0x11] = 0;
        local_2138.data._M_elems[0x12] = 0;
        local_2138.data._M_elems[0x13] = 0;
        local_2138.data._M_elems[0x14] = 0;
        local_2138.data._M_elems[0x15] = 0;
        local_2138.data._M_elems[0x16] = 0;
        local_2138.data._M_elems[0x17] = 0;
        local_2138.data._M_elems[0x18] = 0;
        local_2138.data._M_elems[0x19] = 0;
        local_2138.data._M_elems._104_5_ = 0;
        local_2138.data._M_elems[0x1b]._1_3_ = 0;
        local_2138.exp = 0;
        local_2138.neg = false;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_2138,&pnVar16->m_backend,&local_2838);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_17b0,this);
        bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1730,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_2138,&local_17b0);
        if (bVar4) {
          ::soplex::infinity::__tls_init();
          local_27b8.fpclass = cpp_dec_float_finite;
          local_27b8.prec_elem = 0x1c;
          local_27b8.data._M_elems[0] = 0;
          local_27b8.data._M_elems[1] = 0;
          local_27b8.data._M_elems[2] = 0;
          local_27b8.data._M_elems[3] = 0;
          local_27b8.data._M_elems[4] = 0;
          local_27b8.data._M_elems[5] = 0;
          local_27b8.data._M_elems[6] = 0;
          local_27b8.data._M_elems[7] = 0;
          local_27b8.data._M_elems[8] = 0;
          local_27b8.data._M_elems[9] = 0;
          local_27b8.data._M_elems[10] = 0;
          local_27b8.data._M_elems[0xb] = 0;
          local_27b8.data._M_elems[0xc] = 0;
          local_27b8.data._M_elems[0xd] = 0;
          local_27b8.data._M_elems[0xe] = 0;
          local_27b8.data._M_elems[0xf] = 0;
          local_27b8.data._M_elems[0x10] = 0;
          local_27b8.data._M_elems[0x11] = 0;
          local_27b8.data._M_elems[0x12] = 0;
          local_27b8.data._M_elems[0x13] = 0;
          local_27b8.data._M_elems[0x14] = 0;
          local_27b8.data._M_elems[0x15] = 0;
          local_27b8.data._M_elems[0x16] = 0;
          local_27b8.data._M_elems[0x17] = 0;
          local_27b8.data._M_elems[0x18] = 0;
          local_27b8.data._M_elems[0x19] = 0;
          local_27b8.data._M_elems._104_5_ = 0;
          local_27b8.data._M_elems[0x1b]._1_3_ = 0;
          local_27b8.exp = 0;
          local_27b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_27b8,-a);
          if ((((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
              (local_27b8.fpclass != cpp_dec_float_NaN)) &&
             (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&pnVar18->m_backend,&local_27b8), 0 < iVar5)) {
            if ((this->m_loJ).m_backend.fpclass == cpp_dec_float_NaN) goto LAB_0058ed14;
            fVar1 = (this->m_upJ).m_backend.fpclass;
            goto joined_r0x0058d7ad;
          }
        }
        iVar5 = this->m_k;
        pnVar24 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar12 = pnVar24 + iVar5;
        pnVar17 = &local_1830;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar17->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar17 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        local_1830.m_backend.exp = pnVar24[iVar5].m_backend.exp;
        local_1830.m_backend.neg = pnVar24[iVar5].m_backend.neg;
        local_1830.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
        local_1830.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
        pnVar17 = &this->m_upJ;
        local_2838.fpclass = cpp_dec_float_finite;
        local_2838.prec_elem = 0x1c;
        local_2838.data._M_elems[0] = 0;
        local_2838.data._M_elems[1] = 0;
        local_2838.data._M_elems[2] = 0;
        local_2838.data._M_elems[3] = 0;
        local_2838.data._M_elems[4] = 0;
        local_2838.data._M_elems[5] = 0;
        local_2838.data._M_elems[6] = 0;
        local_2838.data._M_elems[7] = 0;
        local_2838.data._M_elems[8] = 0;
        local_2838.data._M_elems[9] = 0;
        local_2838.data._M_elems[10] = 0;
        local_2838.data._M_elems[0xb] = 0;
        local_2838.data._M_elems[0xc] = 0;
        local_2838.data._M_elems[0xd] = 0;
        local_2838.data._M_elems[0xe] = 0;
        local_2838.data._M_elems[0xf] = 0;
        local_2838.data._M_elems[0x10] = 0;
        local_2838.data._M_elems[0x11] = 0;
        local_2838.data._M_elems[0x12] = 0;
        local_2838.data._M_elems[0x13] = 0;
        local_2838.data._M_elems[0x14] = 0;
        local_2838.data._M_elems[0x15] = 0;
        local_2838.data._M_elems[0x16] = 0;
        local_2838.data._M_elems[0x17] = 0;
        local_2838.data._M_elems[0x18] = 0;
        local_2838.data._M_elems[0x19] = 0;
        local_2838.data._M_elems._104_5_ = 0;
        local_2838.data._M_elems[0x1b]._1_3_ = 0;
        local_2838.exp = 0;
        local_2838.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_2838,&pnVar22->m_backend,&pnVar17->m_backend);
        local_21b8.fpclass = cpp_dec_float_finite;
        local_21b8.prec_elem = 0x1c;
        local_21b8.data._M_elems[0] = 0;
        local_21b8.data._M_elems[1] = 0;
        local_21b8.data._M_elems[2] = 0;
        local_21b8.data._M_elems[3] = 0;
        local_21b8.data._M_elems[4] = 0;
        local_21b8.data._M_elems[5] = 0;
        local_21b8.data._M_elems[6] = 0;
        local_21b8.data._M_elems[7] = 0;
        local_21b8.data._M_elems[8] = 0;
        local_21b8.data._M_elems[9] = 0;
        local_21b8.data._M_elems[10] = 0;
        local_21b8.data._M_elems[0xb] = 0;
        local_21b8.data._M_elems[0xc] = 0;
        local_21b8.data._M_elems[0xd] = 0;
        local_21b8.data._M_elems[0xe] = 0;
        local_21b8.data._M_elems[0xf] = 0;
        local_21b8.data._M_elems[0x10] = 0;
        local_21b8.data._M_elems[0x11] = 0;
        local_21b8.data._M_elems[0x12] = 0;
        local_21b8.data._M_elems[0x13] = 0;
        local_21b8.data._M_elems[0x14] = 0;
        local_21b8.data._M_elems[0x15] = 0;
        local_21b8.data._M_elems[0x16] = 0;
        local_21b8.data._M_elems[0x17] = 0;
        local_21b8.data._M_elems[0x18] = 0;
        local_21b8.data._M_elems[0x19] = 0;
        local_21b8.data._M_elems._104_5_ = 0;
        local_21b8.data._M_elems[0x1b]._1_3_ = 0;
        local_21b8.exp = 0;
        local_21b8.neg = false;
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_21b8,&pnVar19->m_backend,&local_2838);
        (*(this->super_PostStep)._vptr_PostStep[7])(&local_18b0,this);
        bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_1830,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_21b8,&local_18b0);
        if (bVar4) {
          ::soplex::infinity::__tls_init();
          local_27b8.fpclass = cpp_dec_float_finite;
          local_27b8.prec_elem = 0x1c;
          local_27b8.data._M_elems[0] = 0;
          local_27b8.data._M_elems[1] = 0;
          local_27b8.data._M_elems[2] = 0;
          local_27b8.data._M_elems[3] = 0;
          local_27b8.data._M_elems[4] = 0;
          local_27b8.data._M_elems[5] = 0;
          local_27b8.data._M_elems[6] = 0;
          local_27b8.data._M_elems[7] = 0;
          local_27b8.data._M_elems[8] = 0;
          local_27b8.data._M_elems[9] = 0;
          local_27b8.data._M_elems[10] = 0;
          local_27b8.data._M_elems[0xb] = 0;
          local_27b8.data._M_elems[0xc] = 0;
          local_27b8.data._M_elems[0xd] = 0;
          local_27b8.data._M_elems[0xe] = 0;
          local_27b8.data._M_elems[0xf] = 0;
          local_27b8.data._M_elems[0x10] = 0;
          local_27b8.data._M_elems[0x11] = 0;
          local_27b8.data._M_elems[0x12] = 0;
          local_27b8.data._M_elems[0x13] = 0;
          local_27b8.data._M_elems[0x14] = 0;
          local_27b8.data._M_elems[0x15] = 0;
          local_27b8.data._M_elems[0x16] = 0;
          local_27b8.data._M_elems[0x17] = 0;
          local_27b8.data._M_elems[0x18] = 0;
          local_27b8.data._M_elems[0x19] = 0;
          local_27b8.data._M_elems._104_5_ = 0;
          local_27b8.data._M_elems[0x1b]._1_3_ = 0;
          local_27b8.exp = 0;
          local_27b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_27b8,a);
          if ((((this->m_upK).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_27b8.fpclass == cpp_dec_float_NaN)) ||
             (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&pnVar19->m_backend,&local_27b8), -1 < iVar5)) goto LAB_0058e40a;
LAB_0058e20e:
          VVar8 = ON_UPPER;
          if (((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) &&
             (VVar8 = ON_UPPER, (this->m_upK).m_backend.fpclass != cpp_dec_float_NaN)) {
            iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&pnVar16->m_backend,&pnVar19->m_backend);
            VVar8 = (uint)(iVar5 == 0) * 2;
          }
          iVar5 = this->m_k;
          cStatus->data[iVar5] = VVar8;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + (ulong)bVar27 * -8 + 4);
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          pnVar24[iVar5].m_backend.exp = (this->m_upK).m_backend.exp;
          pnVar24[iVar5].m_backend.neg = (this->m_upK).m_backend.neg;
          iVar2 = (this->m_upK).m_backend.prec_elem;
          pnVar24[iVar5].m_backend.fpclass = (this->m_upK).m_backend.fpclass;
          pnVar24[iVar5].m_backend.prec_elem = iVar2;
          cStatus->data[this->m_j] = BASIC;
          pcVar6 = &local_2638;
          pcVar13 = &local_26b8;
        }
        else {
LAB_0058e40a:
          iVar5 = this->m_k;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          pnVar23 = &local_1930;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar23->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1930.m_backend.exp = pnVar24[iVar5].m_backend.exp;
          local_1930.m_backend.neg = pnVar24[iVar5].m_backend.neg;
          local_1930.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
          local_1930.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
          local_2838.fpclass = cpp_dec_float_finite;
          local_2838.prec_elem = 0x1c;
          local_2838.data._M_elems[0] = 0;
          local_2838.data._M_elems[1] = 0;
          local_2838.data._M_elems[2] = 0;
          local_2838.data._M_elems[3] = 0;
          local_2838.data._M_elems[4] = 0;
          local_2838.data._M_elems[5] = 0;
          local_2838.data._M_elems[6] = 0;
          local_2838.data._M_elems[7] = 0;
          local_2838.data._M_elems[8] = 0;
          local_2838.data._M_elems[9] = 0;
          local_2838.data._M_elems[10] = 0;
          local_2838.data._M_elems[0xb] = 0;
          local_2838.data._M_elems[0xc] = 0;
          local_2838.data._M_elems[0xd] = 0;
          local_2838.data._M_elems[0xe] = 0;
          local_2838.data._M_elems[0xf] = 0;
          local_2838.data._M_elems[0x10] = 0;
          local_2838.data._M_elems[0x11] = 0;
          local_2838.data._M_elems[0x12] = 0;
          local_2838.data._M_elems[0x13] = 0;
          local_2838.data._M_elems[0x14] = 0;
          local_2838.data._M_elems[0x15] = 0;
          local_2838.data._M_elems[0x16] = 0;
          local_2838.data._M_elems[0x17] = 0;
          local_2838.data._M_elems[0x18] = 0;
          local_2838.data._M_elems[0x19] = 0;
          local_2838.data._M_elems._104_5_ = 0;
          local_2838.data._M_elems[0x1b]._1_3_ = 0;
          local_2838.exp = 0;
          local_2838.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2838,&pnVar22->m_backend,&pnVar17->m_backend);
          local_2238.fpclass = cpp_dec_float_finite;
          local_2238.prec_elem = 0x1c;
          local_2238.data._M_elems[0] = 0;
          local_2238.data._M_elems[1] = 0;
          local_2238.data._M_elems[2] = 0;
          local_2238.data._M_elems[3] = 0;
          local_2238.data._M_elems[4] = 0;
          local_2238.data._M_elems[5] = 0;
          local_2238.data._M_elems[6] = 0;
          local_2238.data._M_elems[7] = 0;
          local_2238.data._M_elems[8] = 0;
          local_2238.data._M_elems[9] = 0;
          local_2238.data._M_elems[10] = 0;
          local_2238.data._M_elems[0xb] = 0;
          local_2238.data._M_elems[0xc] = 0;
          local_2238.data._M_elems[0xd] = 0;
          local_2238.data._M_elems[0xe] = 0;
          local_2238.data._M_elems[0xf] = 0;
          local_2238.data._M_elems[0x10] = 0;
          local_2238.data._M_elems[0x11] = 0;
          local_2238.data._M_elems[0x12] = 0;
          local_2238.data._M_elems[0x13] = 0;
          local_2238.data._M_elems[0x14] = 0;
          local_2238.data._M_elems[0x15] = 0;
          local_2238.data._M_elems[0x16] = 0;
          local_2238.data._M_elems[0x17] = 0;
          local_2238.data._M_elems[0x18] = 0;
          local_2238.data._M_elems[0x19] = 0;
          local_2238.data._M_elems._104_5_ = 0;
          local_2238.data._M_elems[0x1b]._1_3_ = 0;
          local_2238.exp = 0;
          local_2238.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2238,&pnVar16->m_backend,&local_2838);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_19b0,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1930,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_2238,&local_19b0);
          if (bVar4) {
            ::soplex::infinity::__tls_init();
            local_27b8.fpclass = cpp_dec_float_finite;
            local_27b8.prec_elem = 0x1c;
            local_27b8.data._M_elems[0] = 0;
            local_27b8.data._M_elems[1] = 0;
            local_27b8.data._M_elems[2] = 0;
            local_27b8.data._M_elems[3] = 0;
            local_27b8.data._M_elems[4] = 0;
            local_27b8.data._M_elems[5] = 0;
            local_27b8.data._M_elems[6] = 0;
            local_27b8.data._M_elems[7] = 0;
            local_27b8.data._M_elems[8] = 0;
            local_27b8.data._M_elems[9] = 0;
            local_27b8.data._M_elems[10] = 0;
            local_27b8.data._M_elems[0xb] = 0;
            local_27b8.data._M_elems[0xc] = 0;
            local_27b8.data._M_elems[0xd] = 0;
            local_27b8.data._M_elems[0xe] = 0;
            local_27b8.data._M_elems[0xf] = 0;
            local_27b8.data._M_elems[0x10] = 0;
            local_27b8.data._M_elems[0x11] = 0;
            local_27b8.data._M_elems[0x12] = 0;
            local_27b8.data._M_elems[0x13] = 0;
            local_27b8.data._M_elems[0x14] = 0;
            local_27b8.data._M_elems[0x15] = 0;
            local_27b8.data._M_elems[0x16] = 0;
            local_27b8.data._M_elems[0x17] = 0;
            local_27b8.data._M_elems[0x18] = 0;
            local_27b8.data._M_elems[0x19] = 0;
            local_27b8.data._M_elems._104_5_ = 0;
            local_27b8.data._M_elems[0x1b]._1_3_ = 0;
            local_27b8.exp = 0;
            local_27b8.neg = false;
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                      ((cpp_dec_float<200u,int,void> *)&local_27b8,a);
            if ((((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN) &&
                (local_27b8.fpclass != cpp_dec_float_NaN)) &&
               (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&pnVar17->m_backend,&local_27b8), iVar5 < 0)) {
              VVar8 = ON_UPPER;
              if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
                 (VVar8 = ON_UPPER, (this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
                iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                  (&pnVar18->m_backend,&pnVar17->m_backend);
                VVar8 = (uint)(iVar5 == 0) * 2;
              }
              lVar25 = (long)this->m_j;
              cStatus->data[lVar25] = VVar8;
              pnVar12 = (x->val).
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lVar11 = lVar25 * 0x80;
              pnVar24 = pnVar12 + lVar25;
              lVar25 = 0x1c;
              goto LAB_0058f03f;
            }
          }
          iVar5 = this->m_k;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          pnVar23 = &local_1a30;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar23->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
            pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar23 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          local_1a30.m_backend.exp = pnVar24[iVar5].m_backend.exp;
          local_1a30.m_backend.neg = pnVar24[iVar5].m_backend.neg;
          local_1a30.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
          local_1a30.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
          local_2838.fpclass = cpp_dec_float_finite;
          local_2838.prec_elem = 0x1c;
          local_2838.data._M_elems[0] = 0;
          local_2838.data._M_elems[1] = 0;
          local_2838.data._M_elems[2] = 0;
          local_2838.data._M_elems[3] = 0;
          local_2838.data._M_elems[4] = 0;
          local_2838.data._M_elems[5] = 0;
          local_2838.data._M_elems[6] = 0;
          local_2838.data._M_elems[7] = 0;
          local_2838.data._M_elems[8] = 0;
          local_2838.data._M_elems[9] = 0;
          local_2838.data._M_elems[10] = 0;
          local_2838.data._M_elems[0xb] = 0;
          local_2838.data._M_elems[0xc] = 0;
          local_2838.data._M_elems[0xd] = 0;
          local_2838.data._M_elems[0xe] = 0;
          local_2838.data._M_elems[0xf] = 0;
          local_2838.data._M_elems[0x10] = 0;
          local_2838.data._M_elems[0x11] = 0;
          local_2838.data._M_elems[0x12] = 0;
          local_2838.data._M_elems[0x13] = 0;
          local_2838.data._M_elems[0x14] = 0;
          local_2838.data._M_elems[0x15] = 0;
          local_2838.data._M_elems[0x16] = 0;
          local_2838.data._M_elems[0x17] = 0;
          local_2838.data._M_elems[0x18] = 0;
          local_2838.data._M_elems[0x19] = 0;
          local_2838.data._M_elems._104_5_ = 0;
          local_2838.data._M_elems[0x1b]._1_3_ = 0;
          local_2838.exp = 0;
          local_2838.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_2838,&pnVar22->m_backend,&pnVar17->m_backend);
          local_22b8.fpclass = cpp_dec_float_finite;
          local_22b8.prec_elem = 0x1c;
          local_22b8.data._M_elems[0] = 0;
          local_22b8.data._M_elems[1] = 0;
          local_22b8.data._M_elems[2] = 0;
          local_22b8.data._M_elems[3] = 0;
          local_22b8.data._M_elems[4] = 0;
          local_22b8.data._M_elems[5] = 0;
          local_22b8.data._M_elems[6] = 0;
          local_22b8.data._M_elems[7] = 0;
          local_22b8.data._M_elems[8] = 0;
          local_22b8.data._M_elems[9] = 0;
          local_22b8.data._M_elems[10] = 0;
          local_22b8.data._M_elems[0xb] = 0;
          local_22b8.data._M_elems[0xc] = 0;
          local_22b8.data._M_elems[0xd] = 0;
          local_22b8.data._M_elems[0xe] = 0;
          local_22b8.data._M_elems[0xf] = 0;
          local_22b8.data._M_elems[0x10] = 0;
          local_22b8.data._M_elems[0x11] = 0;
          local_22b8.data._M_elems[0x12] = 0;
          local_22b8.data._M_elems[0x13] = 0;
          local_22b8.data._M_elems[0x14] = 0;
          local_22b8.data._M_elems[0x15] = 0;
          local_22b8.data._M_elems[0x16] = 0;
          local_22b8.data._M_elems[0x17] = 0;
          local_22b8.data._M_elems[0x18] = 0;
          local_22b8.data._M_elems[0x19] = 0;
          local_22b8.data._M_elems._104_5_ = 0;
          local_22b8.data._M_elems[0x1b]._1_3_ = 0;
          local_22b8.exp = 0;
          local_22b8.neg = false;
          boost::multiprecision::default_ops::
          eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_22b8,&pnVar16->m_backend,&local_2838);
          (*(this->super_PostStep)._vptr_PostStep[7])(&local_1ab0,this);
          bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&local_1a30,
                             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_22b8,&local_1ab0);
          if (!bVar4) {
LAB_0058eb51:
            iVar5 = this->m_k;
            pnVar24 = (x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pnVar12 = pnVar24 + iVar5;
            pnVar19 = &local_2438;
            for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
              (pnVar19->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
              pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
              pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar19 + ((ulong)bVar27 * -2 + 1) * 4);
            }
            local_2438.m_backend.exp = pnVar24[iVar5].m_backend.exp;
            local_2438.m_backend.neg = pnVar24[iVar5].m_backend.neg;
            local_2438.m_backend.fpclass = pnVar24[iVar5].m_backend.fpclass;
            local_2438.m_backend.prec_elem = pnVar24[iVar5].m_backend.prec_elem;
            local_2838.fpclass = cpp_dec_float_finite;
            local_2838.prec_elem = 0x1c;
            local_2838.data._M_elems[0] = 0;
            local_2838.data._M_elems[1] = 0;
            local_2838.data._M_elems[2] = 0;
            local_2838.data._M_elems[3] = 0;
            local_2838.data._M_elems[4] = 0;
            local_2838.data._M_elems[5] = 0;
            local_2838.data._M_elems[6] = 0;
            local_2838.data._M_elems[7] = 0;
            local_2838.data._M_elems[8] = 0;
            local_2838.data._M_elems[9] = 0;
            local_2838.data._M_elems[10] = 0;
            local_2838.data._M_elems[0xb] = 0;
            local_2838.data._M_elems[0xc] = 0;
            local_2838.data._M_elems[0xd] = 0;
            local_2838.data._M_elems[0xe] = 0;
            local_2838.data._M_elems[0xf] = 0;
            local_2838.data._M_elems[0x10] = 0;
            local_2838.data._M_elems[0x11] = 0;
            local_2838.data._M_elems[0x12] = 0;
            local_2838.data._M_elems[0x13] = 0;
            local_2838.data._M_elems[0x14] = 0;
            local_2838.data._M_elems[0x15] = 0;
            local_2838.data._M_elems[0x16] = 0;
            local_2838.data._M_elems[0x17] = 0;
            local_2838.data._M_elems[0x18] = 0;
            local_2838.data._M_elems[0x19] = 0;
            local_2838.data._M_elems._104_5_ = 0;
            VVar8 = ON_UPPER;
            local_2838.data._M_elems[0x1b]._1_3_ = 0;
            local_2838.exp = 0;
            local_2838.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_2838,&pnVar22->m_backend,&pnVar17->m_backend);
            local_2338.fpclass = cpp_dec_float_finite;
            local_2338.prec_elem = 0x1c;
            local_2338.data._M_elems[0] = 0;
            local_2338.data._M_elems[1] = 0;
            local_2338.data._M_elems[2] = 0;
            local_2338.data._M_elems[3] = 0;
            local_2338.data._M_elems[4] = 0;
            local_2338.data._M_elems[5] = 0;
            local_2338.data._M_elems[6] = 0;
            local_2338.data._M_elems[7] = 0;
            local_2338.data._M_elems[8] = 0;
            local_2338.data._M_elems[9] = 0;
            local_2338.data._M_elems[10] = 0;
            local_2338.data._M_elems[0xb] = 0;
            local_2338.data._M_elems[0xc] = 0;
            local_2338.data._M_elems[0xd] = 0;
            local_2338.data._M_elems[0xe] = 0;
            local_2338.data._M_elems[0xf] = 0;
            local_2338.data._M_elems[0x10] = 0;
            local_2338.data._M_elems[0x11] = 0;
            local_2338.data._M_elems[0x12] = 0;
            local_2338.data._M_elems[0x13] = 0;
            local_2338.data._M_elems[0x14] = 0;
            local_2338.data._M_elems[0x15] = 0;
            local_2338.data._M_elems[0x16] = 0;
            local_2338.data._M_elems[0x17] = 0;
            local_2338.data._M_elems[0x18] = 0;
            local_2338.data._M_elems[0x19] = 0;
            local_2338.data._M_elems._104_5_ = 0;
            local_2338.data._M_elems[0x1b]._1_3_ = 0;
            local_2338.exp = 0;
            local_2338.neg = false;
            boost::multiprecision::default_ops::
            eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&local_2338,&pnVar16->m_backend,&local_2838);
            (*(this->super_PostStep)._vptr_PostStep[7])(&local_1b30,this);
            bVar4 = LTrel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_2438,
                               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_2338,&local_1b30);
            if (!bVar4) {
              puVar7 = (undefined8 *)__cxa_allocate_exception(0x28);
              local_2838.data._M_elems._0_8_ = local_2838.data._M_elems + 4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_2838,"XMAISM09 This should never happen.","");
              *puVar7 = &PTR__SPxException_006a9ee8;
              puVar7[1] = puVar7 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar7 + 1),local_2838.data._M_elems._0_8_,
                         local_2838.data._M_elems._0_8_ + local_2838.data._M_elems._8_8_);
              *puVar7 = &PTR__SPxException_006a9ec0;
              __cxa_throw(puVar7,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
            }
            if (((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) &&
               ((this->m_upJ).m_backend.fpclass != cpp_dec_float_NaN)) {
              iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&pnVar18->m_backend,&pnVar17->m_backend);
              VVar8 = (uint)(iVar5 == 0) * 2;
            }
            lVar11 = (long)this->m_j;
            cStatus->data[lVar11] = VVar8;
            pnVar12 = (x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar25 = lVar11 * 0x80;
            pnVar24 = pnVar12 + lVar11;
            lVar11 = 0x1c;
            goto LAB_0058ec9a;
          }
          ::soplex::infinity::__tls_init();
          local_27b8.fpclass = cpp_dec_float_finite;
          local_27b8.prec_elem = 0x1c;
          local_27b8.data._M_elems[0] = 0;
          local_27b8.data._M_elems[1] = 0;
          local_27b8.data._M_elems[2] = 0;
          local_27b8.data._M_elems[3] = 0;
          local_27b8.data._M_elems[4] = 0;
          local_27b8.data._M_elems[5] = 0;
          local_27b8.data._M_elems[6] = 0;
          local_27b8.data._M_elems[7] = 0;
          local_27b8.data._M_elems[8] = 0;
          local_27b8.data._M_elems[9] = 0;
          local_27b8.data._M_elems[10] = 0;
          local_27b8.data._M_elems[0xb] = 0;
          local_27b8.data._M_elems[0xc] = 0;
          local_27b8.data._M_elems[0xd] = 0;
          local_27b8.data._M_elems[0xe] = 0;
          local_27b8.data._M_elems[0xf] = 0;
          local_27b8.data._M_elems[0x10] = 0;
          local_27b8.data._M_elems[0x11] = 0;
          local_27b8.data._M_elems[0x12] = 0;
          local_27b8.data._M_elems[0x13] = 0;
          local_27b8.data._M_elems[0x14] = 0;
          local_27b8.data._M_elems[0x15] = 0;
          local_27b8.data._M_elems[0x16] = 0;
          local_27b8.data._M_elems[0x17] = 0;
          local_27b8.data._M_elems[0x18] = 0;
          local_27b8.data._M_elems[0x19] = 0;
          local_27b8.data._M_elems._104_5_ = 0;
          local_27b8.data._M_elems[0x1b]._1_3_ = 0;
          local_27b8.exp = 0;
          local_27b8.neg = false;
          boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                    ((cpp_dec_float<200u,int,void> *)&local_27b8,-a);
          if ((((this->m_loK).m_backend.fpclass == cpp_dec_float_NaN) ||
              (local_27b8.fpclass == cpp_dec_float_NaN)) ||
             (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                (&pnVar16->m_backend,&local_27b8), iVar5 < 1)) goto LAB_0058eb51;
          VVar8 = ON_LOWER;
          if ((this->m_loK).m_backend.fpclass != cpp_dec_float_NaN) {
            fVar1 = (this->m_upK).m_backend.fpclass;
            goto joined_r0x0058e941;
          }
LAB_0058e95a:
          iVar5 = this->m_k;
          cStatus->data[iVar5] = VVar8;
          pnVar24 = (x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pnVar12 = pnVar24 + iVar5;
          for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
            pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
          }
          pnVar24[iVar5].m_backend.exp = (this->m_loK).m_backend.exp;
          pnVar24[iVar5].m_backend.neg = (this->m_loK).m_backend.neg;
          iVar2 = (this->m_loK).m_backend.prec_elem;
          pnVar24[iVar5].m_backend.fpclass = (this->m_loK).m_backend.fpclass;
          pnVar24[iVar5].m_backend.prec_elem = iVar2;
          cStatus->data[this->m_j] = BASIC;
          pcVar6 = &local_25b8;
          pcVar13 = &local_2738;
        }
        local_27b8.fpclass = cpp_dec_float_finite;
        local_27b8.prec_elem = 0x1c;
        local_27b8.exp = 0;
        local_27b8.neg = false;
        local_27b8.data._M_elems[0x1b]._1_3_ = 0;
        local_27b8.data._M_elems._104_5_ = 0;
        local_27b8.data._M_elems[0x18] = 0;
        local_27b8.data._M_elems[0x19] = 0;
        local_27b8.data._M_elems[0x16] = 0;
        local_27b8.data._M_elems[0x17] = 0;
        local_27b8.data._M_elems[0x14] = 0;
        local_27b8.data._M_elems[0x15] = 0;
        local_27b8.data._M_elems[0x12] = 0;
        local_27b8.data._M_elems[0x13] = 0;
        local_27b8.data._M_elems[0x10] = 0;
        local_27b8.data._M_elems[0x11] = 0;
        local_27b8.data._M_elems[0xe] = 0;
        local_27b8.data._M_elems[0xf] = 0;
        local_27b8.data._M_elems[0xc] = 0;
        local_27b8.data._M_elems[0xd] = 0;
        local_27b8.data._M_elems[10] = 0;
        local_27b8.data._M_elems[0xb] = 0;
        local_27b8.data._M_elems[8] = 0;
        local_27b8.data._M_elems[9] = 0;
        local_27b8.data._M_elems[6] = 0;
        local_27b8.data._M_elems[7] = 0;
        local_27b8.data._M_elems[4] = 0;
        local_27b8.data._M_elems[5] = 0;
        local_27b8.data._M_elems[2] = 0;
        local_27b8.data._M_elems[3] = 0;
        local_27b8.data._M_elems[0] = 0;
        local_27b8.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_27b8,pcVar6,pcVar13);
        local_2838.fpclass = cpp_dec_float_finite;
        local_2838.prec_elem = 0x1c;
        local_2838.data._M_elems[0] = 0;
        local_2838.data._M_elems[1] = 0;
        local_2838.data._M_elems[2] = 0;
        local_2838.data._M_elems[3] = 0;
        local_2838.data._M_elems[4] = 0;
        local_2838.data._M_elems[5] = 0;
        local_2838.data._M_elems[6] = 0;
        local_2838.data._M_elems[7] = 0;
        local_2838.data._M_elems[8] = 0;
        local_2838.data._M_elems[9] = 0;
        local_2838.data._M_elems[10] = 0;
        local_2838.data._M_elems[0xb] = 0;
        local_2838.data._M_elems[0xc] = 0;
        local_2838.data._M_elems[0xd] = 0;
        local_2838.data._M_elems[0xe] = 0;
        local_2838.data._M_elems[0xf] = 0;
        local_2838.data._M_elems[0x10] = 0;
        local_2838.data._M_elems[0x11] = 0;
        local_2838.data._M_elems[0x12] = 0;
        local_2838.data._M_elems[0x13] = 0;
        local_2838.data._M_elems[0x14] = 0;
        local_2838.data._M_elems[0x15] = 0;
        local_2838.data._M_elems[0x16] = 0;
        local_2838.data._M_elems[0x17] = 0;
        local_2838.data._M_elems[0x18] = 0;
        local_2838.data._M_elems[0x19] = 0;
        local_2838.data._M_elems._104_5_ = 0;
        local_2838.data._M_elems[0x1b]._1_3_ = 0;
        local_2838.exp = 0;
        local_2838.neg = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_2838,&local_27b8,&pnVar22->m_backend);
        iVar5 = this->m_j;
        pnVar24 = (x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar6 = &local_2838;
        pnVar12 = pnVar24 + iVar5;
        for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pcVar6->data)._M_elems[0];
          pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar27 * -8 + 4);
          pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
        }
        pnVar24[iVar5].m_backend.exp = local_2838.exp;
        pnVar24[iVar5].m_backend.neg = local_2838.neg;
        pnVar24[iVar5].m_backend.fpclass = local_2838.fpclass;
        pnVar24[iVar5].m_backend.prec_elem = local_2838.prec_elem;
        break;
      }
      if ((this->m_loJ).m_backend.fpclass != cpp_dec_float_NaN) {
        fVar1 = (this->m_upJ).m_backend.fpclass;
        goto joined_r0x0058d7ad;
      }
LAB_0058ed14:
      VVar8 = ON_LOWER;
LAB_0058ed23:
      lVar25 = (long)this->m_j;
      cStatus->data[lVar25] = VVar8;
      pnVar12 = (x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar11 = lVar25 * 0x80;
      pnVar24 = pnVar12 + lVar25;
      for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
        pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar18 + (ulong)bVar27 * -8 + 4);
        pnVar24 = (pointer)((long)pnVar24 + ((ulong)bVar27 * -2 + 1) * 4);
      }
      pnVar12[lVar25].m_backend.exp = (this->m_loJ).m_backend.exp;
      pnVar12[lVar25].m_backend.neg = (this->m_loJ).m_backend.neg;
      uVar10._0_4_ = (this->m_loJ).m_backend.fpclass;
      uVar10._4_4_ = (this->m_loJ).m_backend.prec_elem;
LAB_0058ed61:
      *(undefined8 *)((long)(&(pnVar12->m_backend).data + 1) + lVar11 + 8U) = uVar10;
      pcVar6 = &(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend;
    }
    local_2838.fpclass = cpp_dec_float_finite;
    local_2838.prec_elem = 0x1c;
    local_2838.data._M_elems[0] = 0;
    local_2838.data._M_elems[1] = 0;
    local_2838.data._M_elems[2] = 0;
    local_2838.data._M_elems[3] = 0;
    local_2838.data._M_elems[4] = 0;
    local_2838.data._M_elems[5] = 0;
    local_2838.data._M_elems[6] = 0;
    local_2838.data._M_elems[7] = 0;
    local_2838.data._M_elems[8] = 0;
    local_2838.data._M_elems[9] = 0;
    local_2838.data._M_elems[10] = 0;
    local_2838.data._M_elems[0xb] = 0;
    local_2838.data._M_elems[0xc] = 0;
    local_2838.data._M_elems[0xd] = 0;
    local_2838.data._M_elems[0xe] = 0;
    local_2838.data._M_elems[0xf] = 0;
    local_2838.data._M_elems[0x10] = 0;
    local_2838.data._M_elems[0x11] = 0;
    local_2838.data._M_elems[0x12] = 0;
    local_2838.data._M_elems[0x13] = 0;
    local_2838.data._M_elems[0x14] = 0;
    local_2838.data._M_elems[0x15] = 0;
    local_2838.data._M_elems[0x16] = 0;
    local_2838.data._M_elems[0x17] = 0;
    local_2838.data._M_elems[0x18] = 0;
    local_2838.data._M_elems[0x19] = 0;
    local_2838.data._M_elems._104_5_ = 0;
    local_2838.data._M_elems[0x1b]._1_3_ = 0;
    local_2838.exp = 0;
    local_2838.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&local_2838,&pnVar22->m_backend,pcVar6);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&(x->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend,&local_2838);
  }
  pnVar16 = &this->m_scale;
  pcVar13 = &(r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[this->m_k].m_backend;
  local_2738.fpclass = cpp_dec_float_finite;
  local_2738.prec_elem = 0x1c;
  local_2738.data._M_elems[0] = 0;
  local_2738.data._M_elems[1] = 0;
  local_2738.data._M_elems[2] = 0;
  local_2738.data._M_elems[3] = 0;
  local_2738.data._M_elems[4] = 0;
  local_2738.data._M_elems[5] = 0;
  local_2738.data._M_elems[6] = 0;
  local_2738.data._M_elems[7] = 0;
  local_2738.data._M_elems[8] = 0;
  local_2738.data._M_elems[9] = 0;
  local_2738.data._M_elems[10] = 0;
  local_2738.data._M_elems[0xb] = 0;
  local_2738.data._M_elems[0xc] = 0;
  local_2738.data._M_elems[0xd] = 0;
  local_2738.data._M_elems[0xe] = 0;
  local_2738.data._M_elems[0xf] = 0;
  local_2738.data._M_elems[0x10] = 0;
  local_2738.data._M_elems[0x11] = 0;
  local_2738.data._M_elems[0x12] = 0;
  local_2738.data._M_elems[0x13] = 0;
  local_2738.data._M_elems[0x14] = 0;
  local_2738.data._M_elems[0x15] = 0;
  local_2738.data._M_elems[0x16] = 0;
  local_2738.data._M_elems[0x17] = 0;
  local_2738.data._M_elems[0x18] = 0;
  local_2738.data._M_elems[0x19] = 0;
  local_2738.data._M_elems._104_5_ = 0;
  local_2738.data._M_elems[0x1b]._1_3_ = 0;
  local_2738.exp = 0;
  local_2738.neg = false;
  pcVar6 = &pnVar16->m_backend;
  if ((&local_2738 != pcVar13) && (pcVar6 = pcVar13, &local_2738 != &pnVar16->m_backend)) {
    pcVar13 = &local_2738;
    for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pcVar13->data)._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar27 * -8 + 4);
      pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar27 * -8 + 4);
    }
    local_2738.exp = (this->m_scale).m_backend.exp;
    local_2738.neg = (this->m_scale).m_backend.neg;
    local_2738.fpclass = (this->m_scale).m_backend.fpclass;
    local_2738.prec_elem = (this->m_scale).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_2738,pcVar6);
  iVar5 = this->m_j;
  pnVar24 = (r->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pcVar6 = &local_2738;
  pnVar12 = pnVar24 + iVar5;
  for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar6->data)._M_elems[0];
    pcVar6 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar6 + (ulong)bVar27 * -8 + 4);
    pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar27 * -2 + 1) * 4);
  }
  pnVar24[iVar5].m_backend.exp = local_2738.exp;
  pnVar24[iVar5].m_backend.neg = local_2738.neg;
  pnVar24[iVar5].m_backend.fpclass = local_2738.fpclass;
  pnVar24[iVar5].m_backend.prec_elem = local_2738.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::DuplicateColsPS::execute(VectorBase<R>& x,
      VectorBase<R>&,
      VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   if(m_isFirst)
   {
#ifdef SOPLEX_CHECK_BASIS_DIM

      if(!this->checkBasisDim(rStatus, cStatus))
      {
         throw SPxInternalCodeException("XMAISM25 Dimension doesn't match after this step.");
      }

#endif
      return;
   }


   // correcting the change of idx by deletion of the columns:
   if(m_isLast)
   {
      for(int i = m_perm.size() - 1; i >= 0; --i)
      {
         if(m_perm[i] >= 0)
         {
            int cIdx_new = m_perm[i];
            int cIdx = i;
            x[cIdx] = x[cIdx_new];
            r[cIdx] = r[cIdx_new];
            cStatus[cIdx] = cStatus[cIdx_new];
         }
      }

      return;
   }

   // primal & basis:
   SOPLEX_ASSERT_WARN("WMAISM03", isNotZero(m_scale, this->epsilon()));

   if(cStatus[m_k] == SPxSolverBase<R>::ON_LOWER)
   {
      x[m_k] = m_loK;

      if(m_scale > 0)
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ON_UPPER)
   {
      x[m_k] = m_upK;

      if(m_scale > 0)
      {
         x[m_j]       = m_upJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else
      {
         x[m_j]       = m_loJ;
         cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::FIXED)
   {
      // => x[m_k] and x[m_j] are also fixed before the corresponding preprocessing step
      x[m_j]       = m_loJ;
      cStatus[m_j] = SPxSolverBase<R>::FIXED;
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::ZERO)
   {
      /* we only aggregate duplicate columns if 0 is contained in their bounds, so we can handle this case properly */
      assert(isZero(x[m_k], this->epsilon()));
      assert(LErel(m_loJ, R(0.0), this->epsilon()));
      assert(GErel(m_upJ, R(0.0), this->epsilon()));
      assert(LErel(m_loK, R(0.0), this->epsilon()));
      assert(GErel(m_upK, R(0.0), this->epsilon()));

      if(isZero(m_loK, this->epsilon()) && isZero(m_upK, this->epsilon()) && m_loK == m_upK)
         cStatus[m_k] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upK, this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loK, R(0.0), this->epsilon()) && GErel(m_upK, R(0.0), this->epsilon()))
         cStatus[m_k] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM05 This should never happen.");

      x[m_j] = 0.0;

      if(isZero(m_loJ, this->epsilon()) && isZero(m_upJ, this->epsilon()) && m_loJ == m_upJ)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else if(isZero(m_loJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      else if(isZero(m_upJ, this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      else if(LErel(m_loJ, R(0.0), this->epsilon()) && GErel(m_upJ, R(0.0), this->epsilon()))
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      else
         throw SPxInternalCodeException("XMAISM06 This should never happen.");
   }
   else if(cStatus[m_k] == SPxSolverBase<R>::BASIC)
   {
      R scale1 = maxAbs(x[m_k], m_loK);
      R scale2 = maxAbs(x[m_k], m_upK);

      if(scale1 < 1.0)
         scale1 = 1.0;

      if(scale2 < 1.0)
         scale2 = 1.0;

      R z1 = (x[m_k] / scale1) - (m_loK / scale1);
      R z2 = (x[m_k] / scale2) - (m_upK / scale2);

      if(isZero(z1, this->epsilon()))
         z1 = 0.0;

      if(isZero(z2, this->epsilon()))
         z2 = 0.0;

      if(m_loJ <= R(-infinity) && m_upJ >= R(infinity) && m_loK <= R(-infinity) && m_upK >= R(infinity))
      {
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
         x[m_j] = 0.0;
      }
      else if(m_scale > 0.0)
      {
         if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM08 This should never happen.");
         }
      }
      else
      {
         assert(m_scale < 0.0);

         if(GErel(x[m_k], m_upK + m_scale * m_loJ, this->epsilon()))
         {
            assert(m_loJ > R(-infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_loJ, this->epsilon()) && m_loJ > R(-infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_j] = m_loJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_upK + m_scale * m_upJ, this->epsilon()) && m_upK < R(infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_k] = m_upK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z2 * scale2 / m_scale;
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_upJ < R(infinity))
         {
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else if(GErel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()) && m_loK > R(-infinity))
         {
            cStatus[m_k] = (m_loK == m_upK) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
            x[m_k] = m_loK;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            x[m_j] = z1 * scale1 / m_scale;
         }
         else if(LTrel(x[m_k], m_loK + m_scale * m_upJ, this->epsilon()))
         {
            assert(m_upJ < R(infinity));
            cStatus[m_j] = (m_loJ == m_upJ) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
            x[m_j] = m_upJ;
            x[m_k] -= m_scale * x[m_j];
         }
         else
         {
            throw SPxInternalCodeException("XMAISM09 This should never happen.");
         }
      }
   }

   // dual:
   r[m_j] = m_scale * r[m_k];
}